

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MiniParse
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData param_4,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  anon_class_24_3_6b4a22af f;
  anon_class_24_3_6b4a22af f_00;
  anon_class_24_3_6b4a22af f_01;
  anon_class_24_3_6b4a22af f_02;
  ushort uVar8;
  int iVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 in_RAX;
  FieldEntry *pFVar10;
  char *pcVar11;
  undefined7 extraout_var;
  TailCallParseFunc UNRECOVERED_JUMPTABLE_01;
  long lVar12;
  RepeatedField<unsigned_long> *this;
  ushort *puVar13;
  RepeatedField<unsigned_int> *this_00;
  undefined7 extraout_var_00;
  string *psVar14;
  undefined7 extraout_var_01;
  MessageLite *pMVar15;
  char *pcVar16;
  TcParseTableBase *pTVar17;
  void *pvVar18;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar19;
  ParseContext *ctx_00;
  uint *puVar20;
  ulong uVar21;
  Nonnull<const_char_*> pcVar22;
  uint uVar23;
  code *UNRECOVERED_JUMPTABLE_00;
  TcFieldData TVar24;
  code *arena;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar25;
  uint uVar26;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  FieldEntry *extraout_RDX_01;
  FieldEntry *entry;
  undefined8 extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  ParseContext *extraout_RDX_04;
  ParseContext *extraout_RDX_05;
  ParseContext *extraout_RDX_06;
  ParseContext *extraout_RDX_07;
  ParseContext *extraout_RDX_08;
  ParseContext *extraout_RDX_09;
  ParseContext *extraout_RDX_10;
  ParseContext *extraout_RDX_11;
  ParseContext *extraout_RDX_12;
  ParseContext *extraout_RDX_13;
  long *plVar27;
  undefined8 extraout_RDX_14;
  ParseContext *extraout_RDX_15;
  ParseContext *extraout_RDX_16;
  ParseContext *pPVar28;
  ParseContext *extraout_RDX_17;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar29;
  ParseContext *extraout_RDX_18;
  ushort uVar30;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paVar31;
  undefined4 *puVar32;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar33;
  uint uVar34;
  uint7 uVar36;
  uint64_t *puVar35;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar37;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 ptr_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar38;
  Arena *pAVar39;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar40;
  undefined8 *puVar41;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar42;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar43;
  uint16_t uVar44;
  uint uVar45;
  ushort uVar46;
  int iVar47;
  FieldEntry *pFVar48;
  long lVar49;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar50;
  undefined4 uVar51;
  bool bVar52;
  bool bVar53;
  byte bVar54;
  bool bVar55;
  string_view sVar56;
  pair<const_char_*,_int> pVar57;
  pair<const_char_*,_int> pVar58;
  string_view sVar59;
  pair<const_char_*,_int> pVar60;
  pair<const_char_*,_int> pVar61;
  string_view data;
  string_view wire_bytes;
  string_view wire_bytes_00;
  string_view wire_bytes_01;
  byte bStack_a9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_88;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_80;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_78;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_70;
  undefined1 auStack_68 [8];
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_50;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_48;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_38;
  
  bVar54 = 0;
  bVar1 = *ptr;
  uVar34 = (uint)bVar1;
  aVar29.data = (long)ptr + 1U;
  if ((char)bVar1 < '\0') {
    uVar36 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
    cVar2 = *(char *)((long)ptr + 1U);
    lVar12 = CONCAT71(uVar36,cVar2);
    if (cVar2 < '\0') {
      uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
      lVar12 = CONCAT71(uVar36,ptr[2]);
      if (ptr[2] < '\0') {
        uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
        lVar12 = CONCAT71(uVar36,ptr[3]);
        if (ptr[3] < '\0') {
          uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            uVar34 = 0;
            aVar29.data = 0;
          }
          else {
            uVar34 = (int)CONCAT71(uVar36,ptr[4]) << 0x1c | (uint)(uVar36 >> 0x1c);
            ptr = (char *)((long)ptr + 5);
            aVar29.data = (uint64_t)ptr;
          }
        }
        else {
          uVar34 = (int)lVar12 << 0x15 | (uint)(uVar36 >> 0x23);
          ptr = (char *)((long)ptr + 4);
          aVar29.data = (uint64_t)ptr;
        }
      }
      else {
        uVar34 = (int)lVar12 << 0xe | (uint)(uVar36 >> 0x2a);
        ptr = (char *)((long)ptr + 3);
        aVar29.data = (uint64_t)ptr;
      }
    }
    else {
      uVar34 = (int)lVar12 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
      ptr = (char *)((long)ptr + 2);
      aVar29.data = (uint64_t)ptr;
    }
  }
  if ((EpsCopyInputStream *)aVar29.data == (EpsCopyInputStream *)0x0) {
    pcVar11 = Error(msg,ptr,ctx,param_4,table,hasbits);
    return pcVar11;
  }
  aStack_40.data = 0x21336f;
  aStack_38 = in_RAX;
  pFVar10 = FindFieldEntry(table,uVar34 >> 3);
  if (pFVar10 == (FieldEntry *)0x0) {
    TVar24.field_0.data._4_4_ = 0;
    TVar24.field_0.data._0_4_ = uVar34;
    pcVar11 = (*table->fallback)(msg,(char *)aVar29,ctx,TVar24,table,hasbits);
    return pcVar11;
  }
  uVar26 = (int)pFVar10 - (int)table;
  UNRECOVERED_JUMPTABLE_00._4_4_ = uVar26;
  UNRECOVERED_JUMPTABLE_00._0_4_ = uVar34;
  aVar37._0_4_ = (uint)hasbits;
  aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
  switch(pFVar10->type_card & 0xf) {
  case 0:
    pcVar11 = (*table->fallback)(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                                 hasbits);
    return pcVar11;
  case 1:
    pFVar10 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)uVar26);
    if (((ulong)pFVar10 & 3) != 0) {
      aStack_80.data = 0x21fde0;
      AlignFail(pFVar10);
    }
    uVar46 = pFVar10->type_card;
    uVar26 = uVar46 & 0x30;
    if (uVar26 == 0x20) {
      pcVar11 = MpRepeatedVarint<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if ((uVar34 & 7) != 0) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_0021fb61;
    }
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar29;
    pPVar28 = ctx;
    if ((long)aVar43.data < 0) {
      ptr_00.data = 0xffffffffffffff80;
      aVar40.data = (long)*(char *)(aVar29.data + 1) << 7 | 0x7f;
      if ((long)aVar40 < 0) {
        pPVar28 = (ParseContext *)((long)*(char *)(aVar29.data + 2) << 0xe | 0x3fff);
        if ((long)pPVar28 < 0) {
          aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 3) << 0x15 | 0x1fffffU);
          if ((long)aVar40 < 0) {
            pPVar28 = (ParseContext *)
                      ((ulong)pPVar28 & ((long)*(char *)(aVar29.data + 4) << 0x1c | 0xfffffffU));
            if ((long)pPVar28 < 0) {
              aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 5) << 0x23 | 0x7ffffffffU);
              if ((long)aVar40 < 0) {
                pPVar28 = (ParseContext *)
                          ((ulong)pPVar28 &
                          ((long)*(char *)(aVar29.data + 6) << 0x2a | 0x3ffffffffffU));
                if ((long)pPVar28 < 0) {
                  aVar40.data = aVar40.data &
                                ((long)*(char *)(aVar29.data + 7) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar40 < 0) {
                    pPVar28 = (ParseContext *)
                              ((ulong)pPVar28 &
                              ((ulong)*(byte *)(aVar29.data + 8) << 0x38 | 0xffffffffffffff));
                    if ((long)pPVar28 < 0) {
                      aVar50.data = aVar29.data + 10;
                      if (*(char *)(aVar29.data + 9) != '\x01') {
                        bVar1 = *(byte *)(aVar29.data + 9);
                        ptr_00.data._1_7_ = 0xffffffffffffff;
                        ptr_00.data._0_1_ = bVar1;
                        if ((char)bVar1 < '\0') {
                          aVar50.data = 0;
                          goto LAB_0021fb85;
                        }
                        if ((bVar1 & 1) == 0) {
                          pPVar28 = (ParseContext *)((ulong)pPVar28 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      aVar50.data = aVar29.data + 9;
                    }
                  }
                  else {
                    aVar50.data = aVar29.data + 8;
                  }
                }
                else {
                  aVar50.data = aVar29.data + 7;
                }
              }
              else {
                aVar50.data = aVar29.data + 6;
              }
            }
            else {
              aVar50.data = aVar29.data + 5;
            }
          }
          else {
            aVar50.data = aVar29.data + 4;
          }
        }
        else {
          aVar50.data = aVar29.data + 3;
        }
        aVar40.data = aVar40.data & (ulong)pPVar28;
      }
      else {
        aVar50.data = aVar29.data + 2;
      }
      aVar43.data = aVar43.data & aVar40.data;
    }
    else {
      aVar50.data = aVar29.data + 1;
      aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      ptr_00 = aVar29;
    }
LAB_0021fb85:
    if ((EpsCopyInputStream *)aVar50.data == (EpsCopyInputStream *)0x0) {
      pcVar11 = Error(msg,(char *)ptr_00,pPVar28,(TcFieldData)aVar40,table,hasbits);
      return pcVar11;
    }
    uVar23 = uVar46 & 0x600;
    pPVar28 = (ParseContext *)(ulong)uVar23;
    aVar37._0_4_ = uVar46 & 0x1c0;
    aVar37.data._4_4_ = 0;
    uVar45 = (uint)aVar43.data;
    aVar40 = aVar37;
    if ((EpsCopyInputStream *)aVar37.data == (EpsCopyInputStream *)0xc0) {
      if (uVar23 == 0x200) {
        aVar43.data = -(ulong)(uVar45 & 1) ^ aVar43.data >> 1;
      }
    }
    else if (aVar37._0_4_ == 0x80) {
      if ((uVar46 >> 10 & 1) == 0) {
        if (uVar23 == 0x200) {
          aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   (long)(int)(-(uVar45 & 1) ^ (uint)(aVar43.data >> 1) & 0x7fffffff);
        }
      }
      else {
        aStack_70.data = (ulong)CONCAT24(uVar46,aStack_70._0_4_) & 0x1c0ffffffff;
        puVar6 = *(uint32_t **)
                  ((long)&table->has_bits_offset +
                  (ulong)pFVar10->aux_idx * 8 + (ulong)table->aux_offset);
        aStack_58 = aVar37;
        if (uVar23 == 0x600) {
          bVar52 = (int)puVar6 <= (int)uVar45;
          pPVar28 = (ParseContext *)(ulong)CONCAT31(6,bVar52);
          bVar52 = (int)uVar45 <= (int)((ulong)puVar6 >> 0x20) && bVar52;
        }
        else {
          aStack_80.data = 0x21fc69;
          auStack_68 = (undefined1  [8])hasbits;
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
          aStack_50 = aVar50;
          aStack_48 = aVar43;
          bVar52 = ValidateEnum(uVar45,puVar6);
          ctx = (ParseContext *)aStack_60;
          hasbits = (uint64_t)auStack_68;
          aVar43 = aStack_48;
          aVar50 = aStack_50;
        }
        aVar37._0_4_ = (uint)((ulong)aStack_70 >> 0x20);
        aVar40 = aStack_58;
        if (bVar52 == false) {
          pcVar11 = MpUnknownEnumFallback
                              (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                               hasbits);
          return pcVar11;
        }
      }
    }
    aVar29 = aVar50;
    if (uVar26 == 0x30) {
      aStack_70.data._4_4_ = aVar37._0_4_;
      aStack_80.data = 0x21fce6;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_58 = aVar40;
      ChangeOneof(table,pFVar10,uVar34 >> 3,pPVar28,msg);
      aVar37._0_4_ = (uint)((ulong)aStack_70 >> 0x20);
      aVar40 = aStack_58;
      ctx = (ParseContext *)aStack_60;
    }
    else if (uVar26 == 0x10) {
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar10->has_idx >> 5) * 4);
      if (((ulong)puVar20 & 3) != 0) goto LAB_0021fe38;
      *puVar20 = *puVar20 | 1 << ((byte)pFVar10->has_idx & 0x1f);
    }
    if (aVar37._0_4_ == 0xc0) {
      paVar31 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                ((long)&msg->_vptr_MessageLite + (ulong)pFVar10->offset);
      if (((ulong)paVar31 & 7) != 0) {
        aStack_80.data = 0x21fe42;
        AlignFail();
      }
      paVar31->data = (uint64_t)aVar43;
    }
    else if (aVar37._0_4_ == 0x80) {
      puVar32 = (undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)pFVar10->offset);
      if (((ulong)puVar32 & 3) != 0) {
LAB_0021fe38:
        aStack_80.data = 0x21fe3d;
        AlignFail();
      }
      *puVar32 = (int)aVar43.data;
    }
    else {
      if (aVar37._0_4_ == 0) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_80.data = 0x21fe69;
        auStack_68 = (undefined1  [8])hasbits;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (aVar40.data,0,"rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
        hasbits = (uint64_t)auStack_68;
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_80.data = 0x21ff28;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar22);
        aStack_80.data = 0x21ff30;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      *(bool *)((long)&msg->_vptr_MessageLite + (ulong)pFVar10->offset) =
           (EpsCopyInputStream *)aVar43.data != (EpsCopyInputStream *)0x0;
    }
    if (*(EpsCopyInputStream **)ctx <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          aStack_80.data = 0x21fe4a;
          AlignFail(puVar20);
        }
        *puVar20 = *puVar20 | (uint)hasbits;
      }
      return (char *)aVar29.data;
    }
    uVar34 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar34 & 7) != 0) {
      aStack_80.data = 0x21fe94;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar21 = (ulong)(uVar34 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar21);
LAB_0021fb61:
    pcVar11 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  case 2:
    uVar21 = (long)&table->has_bits_offset + (ulong)uVar26;
    if ((uVar21 & 3) != 0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22013c;
      AlignFail();
    }
    if ((uVar34 & 7) != 2) {
      pcVar11 = MpRepeatedVarint<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar46 = *(ushort *)(uVar21 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar20 & 3) != 0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220144;
        AlignFail(puVar20);
      }
      *puVar20 = *puVar20 | aVar37._0_4_;
    }
    uVar30 = uVar46 >> 6;
    uVar8 = uVar30 & 7;
    if ((uVar30 & 7) == 0) {
      pcVar11 = MpPackedVarintT<false,bool,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar34 = uVar46 & 0x600;
    if (uVar8 == 2) {
      switch(uVar34) {
      default:
        pcVar11 = MpPackedVarintT<false,unsigned_int,(unsigned_short)0>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      case 0x200:
      case 0x220:
      case 0x240:
      case 0x260:
      case 0x280:
      case 0x2a0:
      case 0x2c0:
      case 0x2e0:
      case 0x300:
      case 800:
      case 0x340:
      case 0x360:
      case 0x380:
      case 0x3a0:
      case 0x3c0:
      case 0x3e0:
        pcVar11 = MpPackedVarintT<false,unsigned_int,(unsigned_short)512>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      case 0x400:
      case 0x420:
      case 0x440:
      case 0x460:
      case 0x480:
      case 0x4a0:
      case 0x4c0:
      case 0x4e0:
      case 0x500:
      case 0x520:
      case 0x540:
      case 0x560:
      case 0x580:
      case 0x5a0:
      case 0x5c0:
      case 0x5e0:
        pcVar11 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      case 0x600:
      case 0x620:
      case 0x640:
      case 0x660:
      case 0x680:
      case 0x6a0:
      case 0x6c0:
      case 0x6e0:
      case 0x700:
      case 0x720:
      case 0x740:
      case 0x760:
      case 0x780:
      case 0x7a0:
      case 0x7c0:
      case 0x7e0:
        pcVar11 = MpPackedVarintT<false,unsigned_int,(unsigned_short)1536>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      }
    }
    if (uVar8 != 3) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22016b;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    if ((short)uVar34 == 0) {
      pcVar11 = MpPackedVarintT<false,unsigned_long,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if (uVar34 == 0x200) {
      pcVar22 = (Nonnull<const_char_*>)0x0;
    }
    else {
      aStack_50.data = 0x220155;
      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar34,0x200,"xform_val == +field_layout::kTvZigZag");
    }
    if (pcVar22 != (Nonnull<const_char_*>)0x0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220187;
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&aStack_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x8db,pcVar22);
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_0022018f;
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&aStack_40);
    }
    pcVar11 = MpPackedVarintT<false,unsigned_long,(unsigned_short)512>
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  case 3:
    pFVar10 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)uVar26);
    if (((ulong)pFVar10 & 3) != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220335;
      AlignFail(pFVar10);
    }
    uVar46 = pFVar10->type_card & 0x30;
    if (uVar46 == 0x20) {
      pcVar11 = MpRepeatedFixed<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar26 = pFVar10->type_card & 0x1c0;
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if ((ulong)uVar26 == 0xc0) {
      if ((uVar34 & 7) != 1) {
LAB_00220253:
        UNRECOVERED_JUMPTABLE_01 = table->fallback;
        goto LAB_002202f3;
      }
    }
    else {
      if (uVar26 == 0x80) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70.data = 0x22035d;
        aStack_60 = aVar29;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        aStack_48.data = hasbits;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar26,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        ctx = (ParseContext *)aStack_58;
        aVar29 = aStack_60;
        msg = (MessageLite *)aStack_50;
        hasbits = aStack_48.data;
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2203a4;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar22);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2203ac;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      if ((uVar34 & 7) != 5) goto LAB_00220253;
    }
    if (uVar46 == 0x30) {
      aStack_70.data = 0x220280;
      aStack_60 = aVar29;
      ChangeOneof(table,pFVar10,uVar34 >> 3,(ParseContext *)aVar43,msg);
      aVar29 = aStack_60;
    }
    else if (uVar46 == 0x10) {
      puVar20 = (uint *)((long)msg + (ulong)((uint)pFVar10->has_idx >> 5) * 4);
      if (((ulong)puVar20 & 3) != 0) goto LAB_00220376;
      *puVar20 = *puVar20 | 1 << ((byte)pFVar10->has_idx & 0x1f);
    }
    puVar41 = (undefined8 *)((ulong)pFVar10->offset + (long)msg);
    if (uVar26 == 0xc0) {
      if (((ulong)puVar41 & 7) != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220380;
        AlignFail();
      }
      *puVar41 = *(undefined8 *)aVar29;
      lVar12 = 8;
    }
    else {
      if (((ulong)puVar41 & 3) != 0) {
LAB_00220376:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22037b;
        AlignFail();
      }
      *(undefined4 *)puVar41 = *(undefined4 *)aVar29;
      lVar12 = 4;
    }
    aVar29.data = aVar29.data + lVar12;
    if (*(EpsCopyInputStream **)ctx <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)msg + (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220388;
          AlignFail(puVar20);
        }
        *puVar20 = *puVar20 | (uint)hasbits;
      }
      return (char *)aVar29.data;
    }
    uVar34 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar34 & 7) != 0) {
      aStack_70.data = (uint64_t)MpPackedFixed<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar21 = (ulong)(uVar34 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar21);
LAB_002202f3:
    pcVar11 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  case 4:
    puVar20 = (uint *)((long)&table->has_bits_offset + (ulong)uVar26);
    if (((ulong)puVar20 & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220526;
      AlignFail(puVar20);
    }
    if ((uVar34 & 7) != 2) {
      pcVar11 = MpRepeatedFixed<false>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar46 = *(ushort *)((long)puVar20 + 10);
    bVar1 = *(byte *)aVar29;
    uVar34 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22043c;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48.data = hasbits;
      pVar60 = ReadSizeFallback((char *)aVar29,(uint)bVar1);
      pcVar11 = pVar60.first;
      uVar34 = pVar60.second;
    }
    else {
      pcVar11 = (char *)(aVar29.data + 1);
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      aStack_48.data = hasbits;
    }
    aVar29 = aStack_50;
    uVar26 = uVar46 & 0x1c0;
    if ((ulong)uVar26 == 0xc0) {
      aVar43.data = (long)(_func_int ***)aStack_50 + (ulong)*puVar20;
      if ((aVar43.data & 7) != 0) {
LAB_00220526:
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22052e;
        AlignFail(aVar43.data);
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220472;
      puVar13 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          (&ctx->super_EpsCopyInputStream,pcVar11,uVar34,
                           (RepeatedField<unsigned_long> *)aVar43);
      pPVar28 = extraout_RDX;
    }
    else {
      if (uVar26 == 0x80) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22055b;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar26,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      }
      aVar29 = aStack_50;
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220584;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar22);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22058c;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      aVar43.data = (long)(_func_int ***)aStack_50 + (ulong)*puVar20;
      if ((aVar43.data & 7) != 0) goto LAB_00220526;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2204ad;
      puVar13 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          (&ctx->super_EpsCopyInputStream,pcVar11,uVar34,
                           (RepeatedField<unsigned_int> *)aVar43);
      pPVar28 = extraout_RDX_00;
    }
    if (puVar13 == (ushort *)0x0) {
      pcVar11 = Error((MessageLite *)aVar29,pcVar11,pPVar28,(TcFieldData)aVar43,table,aStack_48.data
                     );
      return pcVar11;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar13) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)&((MessageLite *)aVar29.data)->_vptr_MessageLite +
                          (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220568;
          AlignFail(puVar20);
        }
        *puVar20 = *puVar20 | (uint)aStack_48.data;
      }
      return (char *)puVar13;
    }
    uVar34 = (uint)table->fast_idx_mask & (uint)*puVar13;
    if ((uVar34 & 7) != 0) {
      aStack_60.data = (uint64_t)MpString<false>;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar21 = (ulong)(uVar34 & 0xfffffff8);
    pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar21))
                                (aVar29.data,puVar13,ctx,
                                 (ulong)*puVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2),
                                 table);
    return pcVar11;
  case 6:
    pFVar48 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)uVar26);
    pFVar10 = pFVar48;
    if (((ulong)pFVar48 & 3) != 0) {
LAB_00220d09:
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220d0e;
      AlignFail(pFVar10);
    }
    uVar46 = pFVar48->type_card;
    uVar30 = uVar46 & 0x30;
    if (uVar30 == 0x20) {
      if ((uVar46 & 0x1c0) == 0x40) {
        pcVar11 = MpRepeatedMessageOrGroup<false,true>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      }
      if ((uVar46 & 0x1c0) == 0) {
        pcVar11 = MpRepeatedMessageOrGroup<false,false>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      }
LAB_00220acf:
      pcVar11 = (*table->fallback)(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,
                                   table,hasbits);
      return pcVar11;
    }
    uVar26 = uVar34 & 7;
    if ((uVar46 & 0x1c0) == 0x40) {
      if (uVar26 != 3) goto LAB_00220acf;
    }
    else if (((uVar46 & 0x1c0) != 0) || (uVar26 != 2)) goto LAB_00220acf;
    if (uVar30 == 0x30) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220b10;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      aStack_48 = aVar29;
      bVar52 = ChangeOneof(table,pFVar48,uVar34 >> 3,(ParseContext *)(ulong)uVar26,msg);
      uVar21 = CONCAT71(extraout_var,bVar52);
      UNRECOVERED_JUMPTABLE_00 = (code *)aStack_50;
      aVar29 = aStack_48;
    }
    else {
      if (uVar30 == 0x10) {
        pFVar10 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar48->has_idx >> 5) * 4);
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (((ulong)pFVar10 & 3) != 0) goto LAB_00220d09;
        pFVar10->offset = pFVar10->offset | 1 << ((byte)pFVar48->has_idx & 0x1f);
      }
      uVar21 = 0;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar10 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)pFVar10 & 3) != 0) goto LAB_00220d09;
      pFVar10->offset = pFVar10->offset | aVar37._0_4_;
    }
    plVar27 = (long *)((long)&msg->_vptr_MessageLite + (ulong)pFVar48->offset);
    if (((ulong)plVar27 & 7) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220d16;
      AlignFail(plVar27);
    }
    pTVar17 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar48->aux_idx * 8 + (ulong)table->aux_offset);
    aVar19._0_4_ = uVar46 >> 9 & 3;
    aVar19.data._4_4_ = 0;
    if ((short)aVar19._0_4_ != 2) {
      aStack_50.data._0_4_ = (int)uVar21;
      aStack_48 = aVar29;
      if ((uVar46 >> 9 & 3) == 0) {
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar11 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar9 = 0x9c8;
        goto LAB_00220d78;
      }
      if (aVar19._0_4_ != 1) {
        pTVar17 = *(TcParseTableBase **)pTVar17;
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220d39;
      pTVar17 = MessageLite::GetTcParseTable((MessageLite *)pTVar17);
      uVar21 = aStack_50.data & 0xffffffff;
      aVar29 = aStack_48;
    }
    if ((byte)((byte)uVar21 | *plVar27 == 0) == 1) {
      pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar39 & 1) != 0) {
        pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220b95;
      pMVar15 = ClassData::New(pTVar17->class_data,pAVar39);
      *plVar27 = (long)pMVar15;
      aVar19 = aVar29;
    }
    uVar51 = (undefined4)aVar19.data;
    if ((uVar46 & 0x1c0) == 0x40) {
      iVar9 = *(int *)(aStack_58.data + 0x58);
      lVar12 = (long)iVar9 + -1;
      iVar47 = (int)lVar12;
      *(int *)(aStack_58.data + 0x58) = iVar47;
      if ((long)iVar9 < 1) {
        return (char *)0x0;
      }
      lVar49 = (long)*(int *)(aStack_58.data + 0x5c) + 1;
      iVar9 = (int)lVar49;
      *(int *)(aStack_58.data + 0x5c) = iVar9;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220be3;
      pcVar16 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,(char *)aVar29,(ParseContext *)aStack_58,pTVar17)
      ;
      if (pcVar16 == (char *)0x0) {
LAB_00220c22:
        *(int *)(aStack_58.data + 0x5c) = *(int *)(aStack_58.data + 0x5c) + -1;
        *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ + 1;
        uVar3 = *(uint32_t *)(aStack_58.data + 0x50);
        *(uint32_t *)(aStack_58.data + 0x50) = 0;
        if (uVar3 == (uint32_t)UNRECOVERED_JUMPTABLE_00) {
          return pcVar16;
        }
        return (char *)0x0;
      }
      iVar4 = *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_;
      if (iVar47 == iVar4) {
        pcVar11 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220d94;
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar12,(long)iVar4,"old_depth == depth_");
      }
      if (pcVar11 == (Nonnull<const_char_*>)0x0) {
        if (iVar9 == *(int *)(aStack_58.data + 0x5c)) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220dc7;
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar49,(long)*(int *)(aStack_58.data + 0x5c),
                               "old_group_depth == group_depth_");
        }
        if (pcVar11 == (Nonnull<const_char_*>)0x0) goto LAB_00220c22;
        iVar9 = 0x492;
      }
      else {
        iVar9 = 0x491;
      }
    }
    else {
      if ((char)*(byte *)aVar29 < '\0') {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220c55;
        pVar60 = ReadSizeFallback((char *)aVar29,(uint)*(byte *)aVar29);
        pcVar11 = pVar60.first;
      }
      else {
        pcVar11 = (char *)(aVar29.data + 1);
      }
      if ((pcVar11 == (char *)0x0) || (*(int *)(aStack_58.data + 0x58) < 1)) {
        pcVar11 = (char *)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220c7f;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&aStack_40,(char *)aStack_58,(int)pcVar11);
        *(int *)(aStack_58.data + 0x58) = *(int *)(aStack_58.data + 0x58) + -1;
        uVar51 = aStack_40.data._0_4_;
      }
      if (pcVar11 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar9 = *(int *)(aStack_58.data + 0x58);
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220ca9;
      pcVar16 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,pcVar11,(ParseContext *)aStack_58,pTVar17);
      if (pcVar16 == (char *)0x0) {
LAB_00220ccc:
        *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_ + 1;
        uVar34 = uVar51 + *(int *)(aStack_58.data + 0x1c);
        *(uint *)(aStack_58.data + 0x1c) = uVar34;
        if (*(uint32_t *)(aStack_58.data + 0x50) != 0) {
          return (char *)0x0;
        }
        *(char **)aStack_58 = *(char **)(aStack_58.data + 8) + (int)((int)uVar34 >> 0x1f & uVar34);
        return pcVar16;
      }
      iVar47 = *(int *)&((EpsCopyInputStream *)(aStack_58.data + 0x58))->limit_end_;
      if (iVar9 == iVar47) {
        pcVar11 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220daf;
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar9,(long)iVar47,"old_depth == depth_");
      }
      if (pcVar11 == (Nonnull<const_char_*>)0x0) goto LAB_00220ccc;
      iVar9 = 0x481;
    }
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_00220d78:
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220d7d;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&aStack_40,pcVar16,iVar9,pcVar11);
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220d85;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&aStack_40);
  case 7:
    aVar40.data = (long)&table->has_bits_offset + (ulong)uVar26;
    if ((aVar40.data & 3) != 0) {
LAB_00221355:
      AlignFail();
    }
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar34 & 7) != 2)) {
      pcVar11 = MpFallback(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar51 = *(undefined4 *)
              ((long)&table->has_bits_offset +
              (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset);
    aVar50.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar40;
    aVar42.data = hasbits;
    aStack_50.data = aVar40.data;
    if ((bStack_a9 & 2) == 0) {
      if ((aVar50.data & 7) != 0) {
LAB_0022135a:
        AlignFail(aVar50.data);
      }
      if ((*(ulong *)aVar50 & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(aVar50.data,1);
      }
      aVar50.data = aVar50.data + 0x10;
    }
    else if ((aVar50.data & 7) != 0) goto LAB_0022135a;
    aStack_58.data._4_1_ = bStack_a9;
    aStack_58.data._0_4_ = uVar51;
    aStack_58.data._5_3_ = 0;
    aVar40.data = (uint64_t)&aStack_60;
    do {
      pcVar11._2_6_ = 0;
      pcVar11._0_2_ = *(ushort *)(aVar50.data + 0xc);
      aVar19.data = (uint64_t)UntypedMapBase::AllocNode(aVar50.data,(size_t)pcVar11);
      uVar46 = *(ushort *)(aVar50.data + 0xc);
      uVar21 = (ulong)uVar46 - 8;
      if (uVar21 < 8) {
        pcVar11 = (char *)0x8;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                            (uVar21,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)")
        ;
      }
      else {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        pcVar11 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        iVar9 = 0xb2c;
LAB_002213a5:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_80,pcVar11,iVar9,pcVar22);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_80);
      }
      *(char **)(aVar19.data + 8) = (char *)0x0;
      *(undefined8 *)((long)(aVar19.data - 8) + (ulong)uVar46) = 0;
      aVar33.data = (uint64_t)&aStack_48;
      f.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
             *)aVar33.data;
      f.this = (UntypedMapBase *)aVar50.data;
      f.node = (NodeBase **)aVar40.data;
      aStack_80 = aVar50;
      aStack_78.data = aVar33.data;
      aStack_70.data = aVar40.data;
      aStack_60 = aVar19;
      aStack_48 = aVar50;
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar50,f);
      aStack_40.data = (uint64_t)&aStack_88;
      f_00.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
                *)aVar33.data;
      f_00.this = (UntypedMapBase *)aVar50.data;
      f_00.node = (NodeBase **)aVar40.data;
      aVar38 = aVar50;
      wire_bytes._M_len = aVar50;
      aStack_80 = aVar50;
      aStack_78.data = aVar33.data;
      aStack_70.data = aVar40.data;
      aStack_60 = aVar19;
      aStack_48 = aVar50;
      aStack_38 = aVar50;
      UntypedMapBase::
      VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
                ((UntypedMapBase *)aVar50,f_00);
      bVar1 = *(byte *)aVar29;
      aVar25.data._1_7_ = 0;
      aVar25.data._0_1_ = bVar1;
      if ((char)bVar1 < '\0') {
        pcVar11._4_4_ = 0;
        pcVar11._0_4_ = CONCAT31(0,bVar1);
        pVar58 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
        aVar25.data = pVar58._8_8_ & 0xffffffff;
      }
      else {
        pVar58._8_8_ = extraout_RDX_02;
        pVar58.first = (char *)(aVar29.data + 1);
        aVar29 = aVar38;
      }
      pPVar28 = pVar58._8_8_;
      aVar38.data = (uint64_t)pVar58.first;
      if (((EpsCopyInputStream *)aVar38.data == (EpsCopyInputStream *)0x0) || (ctx->depth_ < 1)) {
        aVar38.data = 0;
      }
      else {
        aVar29.data = (uint64_t)&aStack_80;
        pcVar11 = (char *)ctx;
        EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar29,(char *)ctx,(int)pVar58.first);
        auStack_68._4_4_ = aStack_80.data._0_4_;
        ctx->depth_ = ctx->depth_ + -1;
        pPVar28 = extraout_RDX_03;
      }
      if ((EpsCopyInputStream *)aVar38.data == (EpsCopyInputStream *)0x0) {
LAB_00221060:
        ctx_00 = (ParseContext *)0x0;
      }
      else {
        iVar9 = ctx->depth_;
        aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar9;
        aVar25 = aStack_88;
        aVar29 = aVar19;
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
        aVar42 = aStack_50;
        wire_bytes._M_len = aVar50;
        ctx_00 = (ParseContext *)
                 ParseOneMapEntry((NodeBase *)aVar19,(char *)aVar38,ctx,(FieldAux *)aStack_88,table,
                                  (FieldEntry *)aStack_50,(UntypedMapBase *)aVar50);
        pPVar28 = extraout_RDX_04;
        if (ctx_00 != (ParseContext *)0x0) {
          aVar38 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
          if (iVar9 == ctx->depth_) {
            pcVar22 = (Nonnull<const_char_*>)0x0;
          }
          else {
            aVar29 = aVar33;
            pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (aVar33.data,aVar38.data,"old_depth == depth_");
            pPVar28 = extraout_RDX_05;
          }
          if (pcVar22 != (Nonnull<const_char_*>)0x0) {
            pcVar11 = 
            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
            ;
            iVar9 = 0x481;
            goto LAB_002213a5;
          }
        }
        ctx->depth_ = ctx->depth_ + 1;
        uVar26 = (ctx->super_EpsCopyInputStream).limit_ + auStack_68._4_4_;
        (ctx->super_EpsCopyInputStream).limit_ = uVar26;
        pcVar11 = (char *)aVar38;
        if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_00221060;
        aVar25._0_4_ = (int)uVar26 >> 0x1f & uVar26;
        aVar25.data._4_4_ = 0;
        (ctx->super_EpsCopyInputStream).limit_end_ =
             (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar25._0_4_;
      }
      if (ctx_00 == (ParseContext *)0x0) {
        if (*(long *)(aVar50.data + 0x18) == 0) {
          UntypedMapBase::DeleteNode((UntypedMapBase *)aVar50,(NodeBase *)aVar19);
          pPVar28 = extraout_RDX_06;
          pcVar11 = (char *)aVar19;
        }
        pcVar11 = Error(msg,pcVar11,pPVar28,(TcFieldData)aVar25,table,hasbits);
        return pcVar11;
      }
      if ((bStack_a9 & 0x10) == 0) {
LAB_002210a4:
        if (5 < ((byte)(*(uint *)(aVar50.data + 0xc) >> 0x18) & 0xf)) {
switchD_002210ca_caseD_3:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xb68);
        }
        uVar26 = *(uint *)(aVar50.data + 0xc) >> 0x18 & 0xf;
        puVar20 = &switchD_002210ca::switchdataD_00381724;
        pcVar22 = (Nonnull<const_char_*>)
                  ((long)&switchD_002210ca::switchdataD_00381724 +
                  (long)(int)(&switchD_002210ca::switchdataD_00381724)[uVar26]);
        switch(uVar26) {
        case 0:
          KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar50,(KeyNode *)aVar19);
          break;
        case 1:
          KeyMapBase<unsigned_int>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_int> *)aVar50,(KeyNode *)aVar19);
          break;
        case 2:
          KeyMapBase<unsigned_long>::InsertOrReplaceNode
                    ((KeyMapBase<unsigned_long> *)aVar50,(KeyNode *)aVar19);
          break;
        default:
          goto switchD_002210ca_caseD_3;
        case 5:
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::InsertOrReplaceNode
                    ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)aVar50,(KeyNode *)aVar19);
          break;
        case 6:
          LOCK();
          iVar9 = *(int *)(pcVar22 + aVar33.data);
          *(int *)(pcVar22 + aVar33.data) = (int)pcVar22;
          pcVar16 = (char *)CONCAT44((int)((ulong)pcVar22 >> 0x20),iVar9);
          UNLOCK();
          *pcVar16 = *pcVar16 + (char)iVar9;
          aVar40 = aVar50;
          goto code_r0x00222abc;
        case 7:
          cRam00000000011873ab = (cRam00000000011873ab + -0x24) - (0xe8 < (byte)aVar33.data);
          goto code_r0x00222aec;
        case 8:
          puVar20 = (uint *)((ulong)((int)pcVar22 + 0x4634800 +
                                    (uint)(0xffffffffffc7e8db <
                                          (ulong)(long)(int)(&switchD_002210ca::switchdataD_00381724
                                                            )[uVar26])) + 1);
          *puVar20 = *puVar20 | 0x4ce0ffc8;
          aVar40.data = (ulong)pcVar11 & 0xffffffff;
          goto code_r0x00222ad2;
        case 9:
        case 10:
          goto switchD_002210ca_caseD_9;
        case 0xb:
          goto switchD_00222acd_caseD_2;
        case 0xc:
          pcVar11 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)0>
                              ((MessageLite *)wire_bytes._M_len,pcVar11,pPVar28,
                               (TcFieldData)0x381723,(TcParseTableBase *)aVar43,aVar42.data);
          return pcVar11;
        case 0xd:
          goto switchD_00222acd_caseD_9;
        case 0xe:
          goto code_r0x00222f52;
        case 0xf:
          aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar20;
          ctx_00 = pPVar28;
          ctx = (ParseContext *)pcVar11;
          aVar40 = aVar29;
          aVar50 = aVar43;
          goto code_r0x00222f52;
        }
      }
      else {
        puVar20 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar50,(NodeBase *)aVar19)
        ;
        uVar26 = *puVar20;
        puVar20 = *(uint **)(aStack_88.data + 8);
        pcVar11 = (char *)(long)(short)*puVar20;
        aVar29.data._0_4_ = *puVar20 >> 0x10;
        aVar29.data._4_4_ = 0;
        pPVar28 = (ParseContext *)(((long)(int)uVar26 - (long)pcVar11) - (long)aVar29);
        if ((EpsCopyInputStream *)((long)(int)uVar26 - (long)pcVar11) < aVar29.data)
        goto LAB_002210a4;
        uVar23 = puVar20[1];
        pcVar11._4_4_ = 0;
        pcVar11._0_4_ = uVar23;
        aVar29.data._2_6_ = 0;
        aVar29.data._0_2_ = (ushort)uVar23;
        if (aVar29.data <= pPVar28) {
          pPVar28 = (ParseContext *)(ulong)(uVar23 >> 0x10);
          aVar25.data = 0;
          do {
            pcVar11 = (char *)aVar25;
            aVar29._1_7_ = (undefined7)((ulong)aVar29 >> 8);
            aVar29.data._0_1_ = pcVar11 < pPVar28;
            if (pcVar11 >= pPVar28) goto LAB_00221174;
            uVar45 = *(uint *)((long)puVar20 + (long)pcVar11 * 4 + (ulong)(uVar23 >> 3 & 0x1ffc) + 8
                              );
            aVar29.data._4_4_ = 0;
            aVar29.data._0_4_ = uVar45;
            aVar42.data._1_7_ = 0;
            aVar42.data._0_1_ = (int)uVar26 < (int)uVar45;
            aVar43.data = ((long)pcVar11 * 2 - (long)aVar42) + 2;
            aVar25.data = aVar43.data;
          } while (uVar45 != uVar26);
          goto LAB_002210a4;
        }
        aVar29.data._1_1_ = (char)(uVar23 >> 8);
        aVar29.data._0_1_ = (puVar20[((ulong)pPVar28 >> 5) + 2] >> ((uint)pPVar28 & 0x1f) & 1) != 0;
        aVar29.data._2_6_ = 0;
LAB_00221174:
        if ((char)aVar29.data != '\0') goto LAB_002210a4;
        aVar42 = aStack_58;
        WriteMapEntryAsUnknown
                  (msg,table,(UntypedMapBase *)aVar50,uVar34,(NodeBase *)aVar19,
                   SUB85(aStack_58.data,0));
        aVar43 = aVar19;
      }
      pPVar28 = (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_;
      if (pPVar28 <= ctx_00) {
        uVar21 = (ulong)table->has_bits_offset;
        if (uVar21 == 0) {
          return (char *)ctx_00;
        }
        goto LAB_002212b5;
      }
      bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
      uVar26 = (uint)bVar1;
      aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
      if ((char)bVar1 < '\0') {
        uVar36 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
        lVar12 = CONCAT71(uVar36,*(char *)aVar29);
        if (*(char *)aVar29 < '\0') {
          uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
          lVar12 = CONCAT71(uVar36,cVar2);
          if (cVar2 < '\0') {
            uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
            lVar12 = CONCAT71(uVar36,cVar2);
            if (cVar2 < '\0') {
              uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
              cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
              if (cVar2 < '\0') {
                uVar26 = 0;
                aVar29.data = 0;
              }
              else {
                uVar26 = (int)CONCAT71(uVar36,cVar2) << 0x1c | (uint)(uVar36 >> 0x1c);
                aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
              }
            }
            else {
              uVar26 = (int)lVar12 << 0x15 | (uint)(uVar36 >> 0x23);
              aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
            }
          }
          else {
            uVar26 = (int)lVar12 << 0xe | (uint)(uVar36 >> 0x2a);
            aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
          }
        }
        else {
          uVar26 = (int)lVar12 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
          aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
        }
      }
    } while (uVar26 == uVar34);
    if (ctx_00 < pPVar28) {
      uVar46 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
      uVar34 = (uint)table->fast_idx_mask & (uint)uVar46;
      if ((uVar34 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar21 = (ulong)(uVar34 & 0xfffffff8);
      pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar21))
                                  (msg,ctx_00,ctx,
                                   (ulong)uVar46 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2),
                                   table,hasbits);
      return pcVar11;
    }
    uVar21 = (ulong)table->has_bits_offset;
    if (uVar21 != 0) {
LAB_002212b5:
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + uVar21);
      if (((ulong)puVar20 & 3) != 0) goto LAB_00221355;
      *puVar20 = *puVar20 | aVar37._0_4_;
    }
    return (char *)ctx_00;
  case 8:
    if ((ulong)table->has_bits_offset != 0) {
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar20 & 3) != 0) {
        AlignFail();
      }
      *puVar20 = *puVar20 | aVar37._0_4_;
    }
    return (char *)0x0;
  case 9:
    pFVar10 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)uVar26);
    if (((ulong)pFVar10 & 3) != 0) {
      aStack_80.data = 0x2216c7;
      AlignFail(pFVar10);
    }
    uVar46 = pFVar10->type_card;
    uVar26 = uVar46 & 0x30;
    if (uVar26 == 0x20) {
      pcVar11 = MpRepeatedVarint<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if ((uVar34 & 7) != 0) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_00221450;
    }
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)*(char *)aVar29;
    if ((long)aVar43.data < 0) {
      aVar50.data = 0xffffffffffffff80;
      aVar40.data = (long)*(char *)(aVar29.data + 1) << 7 | 0x7f;
      if ((long)aVar40 < 0) {
        uVar21 = (long)*(char *)(aVar29.data + 2) << 0xe | 0x3fff;
        if ((long)uVar21 < 0) {
          aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 3) << 0x15 | 0x1fffffU);
          if ((long)aVar40 < 0) {
            uVar21 = uVar21 & ((long)*(char *)(aVar29.data + 4) << 0x1c | 0xfffffffU);
            if ((long)uVar21 < 0) {
              aVar40.data = aVar40.data & ((long)*(char *)(aVar29.data + 5) << 0x23 | 0x7ffffffffU);
              if ((long)aVar40 < 0) {
                uVar21 = uVar21 & ((long)*(char *)(aVar29.data + 6) << 0x2a | 0x3ffffffffffU);
                if ((long)uVar21 < 0) {
                  aVar40.data = aVar40.data &
                                ((long)*(char *)(aVar29.data + 7) << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar40 < 0) {
                    uVar21 = uVar21 & ((ulong)*(byte *)(aVar29.data + 8) << 0x38 | 0xffffffffffffff)
                    ;
                    if ((long)uVar21 < 0) {
                      aStack_60.data = aVar29.data + 10;
                      if (*(char *)(aVar29.data + 9) != '\x01') {
                        bVar1 = *(byte *)(aVar29.data + 9);
                        aVar50.data._1_7_ = 0xffffffffffffff;
                        aVar50.data._0_1_ = bVar1;
                        if ((char)bVar1 < '\0') {
                          aStack_60.data = 0;
                          goto LAB_00221474;
                        }
                        if ((bVar1 & 1) == 0) {
                          uVar21 = uVar21 ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      aStack_60.data = aVar29.data + 9;
                    }
                  }
                  else {
                    aStack_60.data = aVar29.data + 8;
                  }
                }
                else {
                  aStack_60.data = aVar29.data + 7;
                }
              }
              else {
                aStack_60.data = aVar29.data + 6;
              }
            }
            else {
              aStack_60.data = aVar29.data + 5;
            }
          }
          else {
            aStack_60.data = aVar29.data + 4;
          }
        }
        else {
          aStack_60.data = aVar29.data + 3;
        }
        aVar40.data = aVar40.data & uVar21;
      }
      else {
        aStack_60.data = aVar29.data + 2;
      }
      aVar43.data = aVar43.data & aVar40.data;
    }
    else {
      aStack_60.data = aVar29.data + 1;
      aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      aVar50 = aVar29;
    }
LAB_00221474:
    if ((EpsCopyInputStream *)aStack_60.data == (EpsCopyInputStream *)0x0) {
      pcVar11 = Error(msg,(char *)aVar50,ctx,(TcFieldData)aVar40,table,hasbits);
      return pcVar11;
    }
    aVar37._0_4_ = uVar46 & 0x600;
    pPVar28 = (ParseContext *)(ulong)aVar37._0_4_;
    aStack_48.data._0_4_ = uVar46 & 0x1c0;
    aStack_48.data._4_4_ = 0;
    aStack_50.data = (ulong)CONCAT24(uVar46,aStack_50._0_4_) & 0x1c0ffffffff;
    uVar23 = (uint)aVar43.data;
    if ((EpsCopyInputStream *)aStack_48.data == (EpsCopyInputStream *)0xc0) {
      auStack_68 = (undefined1  [8])hasbits;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (aVar37._0_4_ == 0x200) {
        aVar43.data = -(ulong)(uVar23 & 1) ^ aVar43.data >> 1;
      }
    }
    else {
      auStack_68 = (undefined1  [8])hasbits;
      aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      if (aStack_48.data._0_4_ == 0x80) {
        if ((uVar46 >> 10 & 1) == 0) {
          if (aVar37._0_4_ == 0x200) {
            aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     (long)(int)(-(uVar23 & 1) ^ (uint)(aVar43.data >> 1) & 0x7fffffff);
          }
        }
        else {
          puVar6 = *(uint32_t **)
                    ((long)&table->has_bits_offset +
                    (ulong)pFVar10->aux_idx * 8 + (ulong)table->aux_offset);
          if (aVar37._0_4_ == 0x600) {
            bVar52 = (int)puVar6 <= (int)uVar23;
            pPVar28 = (ParseContext *)(ulong)CONCAT31(6,bVar52);
            bVar52 = (int)uVar23 <= (int)((ulong)puVar6 >> 0x20) && bVar52;
          }
          else {
            aStack_80.data = 0x221555;
            aStack_70 = aVar43;
            bVar52 = ValidateEnum(uVar23,puVar6);
            aVar43 = aStack_70;
          }
          if (bVar52 == false) {
            pcVar11 = MpUnknownEnumFallback
                                (msg,(char *)aVar29,(ParseContext *)aStack_58,
                                 (TcFieldData)UNRECOVERED_JUMPTABLE_00,table,(uint64_t)auStack_68);
            return pcVar11;
          }
        }
      }
    }
    aStack_70 = aVar43;
    if (uVar26 == 0x30) {
      aStack_80.data = 0x2215b2;
      ChangeOneof(table,pFVar10,uVar34 >> 3,pPVar28,msg);
    }
    else if (uVar26 == 0x10) {
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar10->has_idx >> 5) * 4);
      if (((ulong)puVar20 & 3) != 0) {
        aStack_80.data = 0x221736;
        AlignFail();
      }
      *puVar20 = *puVar20 | 1 << ((byte)pFVar10->has_idx & 0x1f);
    }
    aStack_80.data = 0x2215c2;
    pvVar18 = MaybeGetSplitBase(msg,true,table);
    ctx = (ParseContext *)aStack_58;
    if (aStack_50._4_4_ == 0xc0) {
      paVar31 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                ((long)pvVar18 + (ulong)pFVar10->offset);
      if (((ulong)paVar31 & 7) != 0) {
        aStack_80.data = 0x221731;
        AlignFail(paVar31);
      }
      paVar31->data = (uint64_t)aStack_70;
    }
    else if (aStack_50._4_4_ == 0x80) {
      puVar32 = (undefined4 *)((long)pvVar18 + (ulong)pFVar10->offset);
      if (((ulong)puVar32 & 3) != 0) {
        aStack_80.data = 0x22176e;
        AlignFail(puVar32);
      }
      *puVar32 = (int)aStack_70.data;
    }
    else {
      if (aStack_50._4_4_ == 0) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_80.data = 0x221754;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (aStack_48.data,0,
                             "rep == static_cast<uint16_t>(field_layout::kRep8Bits)");
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_80.data = 0x22181a;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x829,pcVar22);
        aStack_80.data = 0x221822;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      *(bool *)((long)pvVar18 + (ulong)pFVar10->offset) =
           (EpsCopyInputStream *)aStack_70.data != (EpsCopyInputStream *)0x0;
    }
    if (*(EpsCopyInputStream **)ctx <= aStack_60.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          aStack_80.data = 0x22173e;
          AlignFail(puVar20);
        }
        *puVar20 = *puVar20 | auStack_68._0_4_;
      }
      return (char *)aStack_60.data;
    }
    uVar34 = (uint)table->fast_idx_mask & (uint)*(ushort *)aStack_60;
    if ((uVar34 & 7) != 0) {
      aStack_80.data = 0x221786;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar21 = (ulong)(uVar34 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aStack_60 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar21);
    aVar29 = aStack_60;
    hasbits = (uint64_t)auStack_68;
LAB_00221450:
    pcVar11 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  case 10:
    uVar21 = (long)&table->has_bits_offset + (ulong)uVar26;
    if ((uVar21 & 3) != 0) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221980;
      AlignFail();
    }
    if ((uVar34 & 7) != 2) {
      pcVar11 = MpRepeatedVarint<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar46 = *(ushort *)(uVar21 + 10);
    if ((ulong)table->has_bits_offset != 0) {
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar20 & 3) != 0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221988;
        AlignFail(puVar20);
      }
      *puVar20 = *puVar20 | aVar37._0_4_;
    }
    uVar30 = uVar46 >> 6;
    uVar8 = uVar30 & 7;
    if ((uVar30 & 7) == 0) {
      pcVar11 = MpPackedVarintT<true,bool,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if (uVar8 == 2) {
      pcVar11 = MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if (uVar8 != 3) {
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2219af;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x8f9);
    }
    uVar34 = uVar46 & 0x600;
    if ((short)uVar34 != 0) {
      if (uVar34 == 0x200) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_50.data = 0x221999;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar34,0x200,"xform_val == +field_layout::kTvZigZag");
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2219cb;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x8db,pcVar22);
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_002219d3;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
    }
    pcVar11 = MpPackedVarintT<true,unsigned_long,(unsigned_short)0>
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  case 0xb:
    pFVar48 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)uVar26);
    pFVar10 = pFVar48;
    if (((ulong)pFVar48 & 3) != 0) goto LAB_00221b8f;
    uVar46 = pFVar48->type_card & 0x30;
    if (uVar46 == 0x20) {
      pcVar11 = MpRepeatedFixed<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar26 = pFVar48->type_card & 0x1c0;
    aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if ((ulong)uVar26 == 0xc0) {
      if ((uVar34 & 7) != 1) {
LAB_00221aa4:
        UNRECOVERED_JUMPTABLE_01 = table->fallback;
        goto LAB_00221b52;
      }
    }
    else {
      if (uVar26 == 0x80) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70.data = 0x221bbc;
        aStack_60.data = hasbits;
        aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
        aStack_48 = aVar29;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar26,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        ctx = (ParseContext *)aStack_58;
        aVar29 = aStack_48;
        msg = (MessageLite *)aStack_50;
        hasbits = aStack_60.data;
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221bf6;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x77f,pcVar22);
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221bfe;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      if ((uVar34 & 7) != 5) goto LAB_00221aa4;
    }
    aStack_60.data = hasbits;
    aStack_58 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    if (uVar46 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221ac6;
      ChangeOneof(table,pFVar48,uVar34 >> 3,(ParseContext *)aVar43,msg);
    }
    else if (uVar46 == 0x10) {
      pFVar10 = (FieldEntry *)((long)msg + (ulong)((uint)pFVar48->has_idx >> 5) * 4);
      if (((ulong)pFVar10 & 3) != 0) goto LAB_00221b8f;
      pFVar10->offset = pFVar10->offset | 1 << ((byte)pFVar48->has_idx & 0x1f);
    }
    aStack_70.data = 0x221ae0;
    pvVar18 = MaybeGetSplitBase(msg,true,table);
    pFVar10 = (FieldEntry *)((ulong)pFVar48->offset + (long)pvVar18);
    if (uVar26 == 0xc0) {
      if (((ulong)pFVar10 & 7) != 0) {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221bda;
        AlignFail();
      }
      uVar7 = *(undefined8 *)aVar29;
      pFVar10->offset = (int)uVar7;
      pFVar10->has_idx = (int)((ulong)uVar7 >> 0x20);
      lVar12 = 8;
    }
    else {
      if (((ulong)pFVar10 & 3) != 0) goto LAB_00221b8f;
      pFVar10->offset = *(uint32_t *)aVar29;
      lVar12 = 4;
    }
    aVar29.data = aVar29.data + lVar12;
    if (aVar29.data < *(EpsCopyInputStream **)aStack_58) {
      uVar34 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
      if ((uVar34 & 7) != 0) {
        aStack_70.data = (uint64_t)MpPackedFixed<true>;
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar21 = (ulong)(uVar34 & 0xfffffff8);
      UNRECOVERED_JUMPTABLE_00 =
           (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2));
      UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar21);
      ctx = (ParseContext *)aStack_58;
      hasbits = aStack_60.data;
LAB_00221b52:
      pcVar11 = (*UNRECOVERED_JUMPTABLE_01)
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if ((ulong)table->has_bits_offset != 0) {
      pFVar10 = (FieldEntry *)((long)msg + (ulong)table->has_bits_offset);
      if (((ulong)pFVar10 & 3) != 0) {
LAB_00221b8f:
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221b94;
        AlignFail(pFVar10);
      }
      pFVar10->offset = pFVar10->offset | (uint)aStack_60.data;
    }
    return (char *)aVar29.data;
  case 0xc:
    puVar20 = (uint *)((long)&table->has_bits_offset + (ulong)uVar26);
    if (((ulong)puVar20 & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221e28;
      AlignFail(puVar20);
    }
    if ((uVar34 & 7) != 2) {
      pcVar11 = MpRepeatedFixed<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar46 = *(ushort *)((long)puVar20 + 10);
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221c69;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_48.data = hasbits;
    pvVar18 = MaybeGetSplitBase(msg,true,table);
    bVar1 = *(byte *)aVar29;
    uVar34 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221ca0;
      pVar60 = ReadSizeFallback((char *)aVar29,(uint)bVar1);
      uVar34 = pVar60.second;
      pcVar11 = pVar60.first;
    }
    else {
      pcVar11 = (char *)(aVar29.data + 1);
    }
    uVar26 = uVar46 & 0x1c0;
    if ((ulong)uVar26 == 0xc0) {
      puVar35 = (uint64_t *)((long)pvVar18 + (ulong)*puVar20);
      if (((ulong)puVar35 & 7) != 0) {
LAB_00221e28:
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221e30;
        AlignFail(puVar35);
      }
      if ((undefined1 *)*puVar35 == kZeroBuffer) {
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar29.data & 1) != 0) {
          aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar29.data & 0xfffffffffffffffe))
                   ->data;
        }
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar29.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221e88;
          this = (RepeatedField<unsigned_long> *)operator_new(0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221e95;
          RepeatedField<unsigned_long>::RepeatedField(this,(Arena *)0x0);
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221cf5;
          pvVar18 = Arena::Allocate((Arena *)aVar29,0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221d05;
          aStack_40 = aVar29;
          this = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                 Construct<google::protobuf::Arena*>(pvVar18,(Arena **)&aStack_40);
        }
        *puVar35 = (uint64_t)this;
      }
      aVar43 = aStack_50;
      aVar29.data = *puVar35;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221d23;
      puVar13 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_long>
                          ((EpsCopyInputStream *)aStack_50,pcVar11,uVar34,
                           (RepeatedField<unsigned_long> *)aVar29);
      pPVar28 = extraout_RDX_07;
    }
    else {
      if (uVar26 == 0x80) {
        pcVar22 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_58.data._4_4_ = uVar34;
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221e61;
        pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((ulong)uVar26,0x80,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
        uVar34 = (uint)((ulong)aStack_58 >> 0x20);
      }
      if (pcVar22 != (Nonnull<const_char_*>)0x0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221ede;
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&aStack_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x7e4,pcVar22);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221ee6;
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&aStack_40);
      }
      puVar35 = (uint64_t *)((long)pvVar18 + (ulong)*puVar20);
      if (((ulong)puVar35 & 7) != 0) goto LAB_00221e28;
      if ((undefined1 *)*puVar35 == kZeroBuffer) {
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
        if ((aVar29.data & 1) != 0) {
          aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar29.data & 0xfffffffffffffffe))
                   ->data;
        }
        if ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar29.data ==
            (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)0x0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221eb0;
          this_00 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221ebd;
          RepeatedField<unsigned_int>::RepeatedField(this_00,(Arena *)0x0);
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221d82;
          pvVar18 = Arena::Allocate((Arena *)aVar29,0x10);
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221d92;
          aStack_40 = aVar29;
          this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                    Construct<google::protobuf::Arena*>(pvVar18,(Arena **)&aStack_40);
        }
        *puVar35 = (uint64_t)this_00;
      }
      aVar43 = aStack_50;
      aVar29.data = *puVar35;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221db0;
      puVar13 = (ushort *)
                EpsCopyInputStream::ReadPackedFixed<unsigned_int>
                          ((EpsCopyInputStream *)aStack_50,pcVar11,uVar34,
                           (RepeatedField<unsigned_int> *)aVar29);
      pPVar28 = extraout_RDX_08;
    }
    if (puVar13 == (ushort *)0x0) {
      pcVar11 = Error(msg,pcVar11,pPVar28,(TcFieldData)aVar29,table,aStack_48.data);
      return pcVar11;
    }
    if ((((ParseContext *)aVar43.data)->super_EpsCopyInputStream).limit_end_ <= puVar13) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221e72;
          AlignFail(puVar20);
        }
        *puVar20 = *puVar20 | (uint)aStack_48.data;
      }
      return (char *)puVar13;
    }
    uVar34 = (uint)table->fast_idx_mask & (uint)*puVar13;
    if ((uVar34 & 7) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&LAB_00221efe;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar21 = (ulong)(uVar34 & 0xfffffff8);
    pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar21))
                                (msg,puVar13,aVar43.data,
                                 (ulong)*puVar13 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2),
                                 table);
    return pcVar11;
  case 0xd:
    aVar43.data = (long)&table->has_bits_offset + (ulong)uVar26;
    if ((aVar43.data & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22231d;
      AlignFail(aVar43.data);
    }
    if ((uVar34 & 7) != 2) {
      UNRECOVERED_JUMPTABLE_01 = table->fallback;
      goto LAB_00221f84;
    }
    uVar46 = *(ushort *)(aVar43.data + 10);
    uVar30 = uVar46 & 0x30;
    if (uVar30 == 0x20) {
      pcVar11 = MpRepeatedString<true>
                          (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    if (uVar30 == 0x10) {
      uVar34 = *(uint *)(aVar43.data + 4);
      UNRECOVERED_JUMPTABLE_00._4_4_ = 0;
      UNRECOVERED_JUMPTABLE_00._0_4_ = uVar34;
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)(uVar34 >> 5) * 4);
      if (((ulong)puVar20 & 3) != 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222343;
        aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aStack_38.data = hasbits;
        AlignFail();
      }
      *puVar20 = *puVar20 | 1 << ((byte)uVar34 & 0x1f);
LAB_00221fec:
      aStack_58.data = aStack_58.data & 0xffffffff00000000;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
    }
    else {
      if (uVar30 != 0x30) goto LAB_00221fec;
      UNRECOVERED_JUMPTABLE_00._0_4_ = uVar34 >> 3;
      UNRECOVERED_JUMPTABLE_00._4_4_ = 0;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x221fe4;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
      bVar52 = ChangeOneof(table,(FieldEntry *)aVar43,UNRECOVERED_JUMPTABLE_00._0_4_,
                           (ParseContext *)UNRECOVERED_JUMPTABLE_00,msg);
      aStack_58.data._0_4_ = (int)CONCAT71(extraout_var_00,bVar52);
    }
    uVar44 = (uint16_t)hasbits;
    aStack_48.data = (ulong)CONCAT24(uVar46,aStack_48.data._0_4_) & 0x600ffffffff;
    aVar40.data = 1;
    aStack_60.data = 0x222016;
    aVar50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    pvVar18 = MaybeGetSplitBase(msg,true,table);
    ctx = (ParseContext *)aStack_50;
    if ((uVar46 & 0x1c0) == 0x140) {
      aVar42.data = (long)pvVar18 + (ulong)*(uint *)aVar43;
      if ((aVar42.data & 7) != 0) goto LAB_00222339;
      if (aStack_58._0_1_ != '\0') {
        *(undefined8 *)aVar42 = 0;
      }
      aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar40.data & 1) != 0) {
        aVar40 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar40.data & 0xfffffffffffffffe);
      }
      uVar34 = (uint)*(byte *)aVar29;
      aStack_40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
      if ((char)*(byte *)aVar29 < '\0') {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22215e;
        pVar60 = ReadSizeFallback((char *)aVar29,uVar34);
        pcVar11 = pVar60.first;
        uVar34 = pVar60.second;
      }
      else {
        pcVar11 = (char *)(aVar29.data + 1);
      }
      aVar29 = aStack_50;
      if (pcVar11 == (char *)0x0) {
        aVar50.data = 0;
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222183;
        aStack_58 = aVar40;
        iVar9 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)aStack_50,pcVar11);
        if (iVar9 < (int)uVar34) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22219d;
          aVar50.data = (uint64_t)
                        EpsCopyInputStream::ReadMicroStringFallback
                                  (aVar29.data,pcVar11,uVar34,aVar42.data,aStack_58.data);
        }
        else {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222211;
          sVar59._M_str = pcVar11;
          sVar59._M_len = (long)(int)uVar34;
          MicroString::SetImpl((MicroString *)aVar42,sVar59,(Arena *)aStack_58,7);
          aVar50.data = (long)pcVar11 + (long)(int)uVar34;
        }
      }
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22221f;
      sVar59 = MicroString::Get((MicroString *)aVar42);
      aVar40.data = (uint64_t)sVar59._M_str;
      aStack_60.data = 0x222236;
      wire_bytes_01._M_str = (char *)table;
      wire_bytes_01._M_len = aVar40.data;
      bVar52 = MpVerifyUtf8((TcParser *)sVar59._M_len,wire_bytes_01,(TcParseTableBase *)aVar43,
                            (FieldEntry *)(aStack_48.data >> 0x20 & 0xffff),uVar44);
      pPVar28 = extraout_RDX_10;
      msg = (MessageLite *)aStack_40;
      ctx = (ParseContext *)aStack_50;
    }
    else if ((uVar46 & 0x1c0) == 0x80) {
      if (uVar30 == 0x30) {
        if (aStack_58._0_1_ == '\0') {
          aVar50.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
          aVar42.data = aVar50.data;
          if ((aVar50.data & 7) != 0) goto LAB_00222339;
          aVar42.data = *aVar50.data;
        }
        else {
          pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar39 & 1) != 0) {
            pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
          }
          if (pAVar39 == (Arena *)0x0) {
            aStack_60.data = 0x22238b;
            aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
          }
          else {
            UNRECOVERED_JUMPTABLE_00 = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
            aVar40.data = 0x10;
            aStack_60.data = 0x2220d7;
            aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                     Arena::AllocateAlignedWithCleanup
                               (pAVar39,0x10,8,
                                cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
          }
          *(undefined8 *)aVar19 = 0;
          *(char **)(aVar19.data + 8) = (char *)0x0;
          aVar50.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
          aVar42.data = aVar50.data;
          if ((aVar50.data & 7) != 0) {
LAB_00222339:
            aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22233e;
            AlignFail(aVar42.data);
          }
          *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar50 = aVar19;
          aVar42 = aVar19;
        }
      }
      else {
        aVar42.data = (long)pvVar18 + (ulong)*(uint *)aVar43;
        if ((aVar42.data & 7) != 0) goto LAB_00222339;
      }
      bVar1 = *(byte *)aVar29;
      if ((char)bVar1 < '\0') {
        aVar40.data._4_4_ = 0;
        aVar40.data._0_4_ = CONCAT31(0,bVar1);
        aStack_60.data = 0x222278;
        pVar60 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
      }
      else {
        pVar60.second._0_1_ = bVar1;
        pVar60.first = (undefined1 *)(aVar29.data + 1);
        pVar60._9_7_ = 0;
        aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
        aVar29 = aVar50;
      }
      pPVar28 = pVar60._8_8_;
      aVar19.data = (uint64_t)pVar60.first;
      if ((EpsCopyInputStream *)aVar19.data == (EpsCopyInputStream *)0x0) {
        aVar50.data = 0;
      }
      else {
        aStack_60.data = 0x222291;
        aVar29 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        aVar50.data = (uint64_t)
                      EpsCopyInputStream::ReadCord
                                (&ctx->super_EpsCopyInputStream,(char *)aVar19,pVar60.second,
                                 aVar42.data);
        aVar43 = aVar42;
        pPVar28 = extraout_RDX_11;
        aVar40 = aVar19;
      }
      bVar52 = (EpsCopyInputStream *)aVar50.data != (EpsCopyInputStream *)0x0;
      if (bVar52) {
        aVar43.data._2_6_ = 0;
        aVar43.data._0_2_ = aStack_48.data._4_2_;
        aStack_60.data = 0x2222ab;
        MpVerifyUtf8((Cord *)aVar29,(TcParseTableBase *)aVar40,(FieldEntry *)pPVar28,
                     aStack_48.data._4_2_);
        bVar52 = true;
        pPVar28 = extraout_RDX_12;
      }
    }
    else {
      if ((uVar46 & 0x1c0) != 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)&UNK_002223b9;
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x967);
      }
      aVar40.data = (long)pvVar18 + (ulong)*(uint *)aVar43;
      aVar42.data = aVar40.data;
      if ((aVar40.data & 7) != 0) goto LAB_00222339;
      if (aStack_58._0_1_ != '\0') {
        *(undefined8 **)aVar40 = &fixed_address_empty_string;
      }
      aVar42 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
      if ((aVar42.data & 1) != 0) {
        aVar42 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(aVar42.data & 0xfffffffffffffffe))->
                 data;
      }
      if (aVar42.data == 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2221b7;
        psVar14 = ArenaStringPtr::MutableNoCopy_abi_cxx11_((ArenaStringPtr *)aVar40,(Arena *)0x0);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2221c5;
        aVar50.data = (uint64_t)InlineGreedyStringParser(psVar14,aVar29.data,ctx);
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222088;
        aVar50.data = (uint64_t)
                      EpsCopyInputStream::ReadArenaString
                                (aStack_50.data,aVar29.data,aVar40.data,aVar42.data);
      }
      if ((EpsCopyInputStream *)aVar50.data == (EpsCopyInputStream *)0x0) {
        aStack_60.data = 0x222366;
        anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)aVar40);
        bVar52 = false;
        aVar43 = aVar42;
        pPVar28 = extraout_RDX_13;
      }
      else {
        uVar21 = *(ulong *)aVar40;
        aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(uVar21 & 0xfffffffffffffffc))->data;
        aStack_60.data = 0x2221f1;
        wire_bytes_00._M_str = (char *)table;
        wire_bytes_00._M_len = aVar40.data;
        bVar52 = MpVerifyUtf8((TcParser *)
                              ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                              (uVar21 & 0xfffffffffffffffc))[1],wire_bytes_00,
                              (TcParseTableBase *)aVar43,
                              (FieldEntry *)(aStack_48.data >> 0x20 & 0xffff),uVar44);
        pPVar28 = extraout_RDX_09;
      }
    }
    aVar29 = aVar50;
    if ((bVar52 == false) || ((EpsCopyInputStream *)aVar29.data == (EpsCopyInputStream *)0x0)) {
      pcVar11 = Error(msg,(char *)aVar40,pPVar28,(TcFieldData)aVar43,table,aStack_38.data);
      return pcVar11;
    }
    if (*(EpsCopyInputStream **)ctx <= aVar29.data) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar20 = (uint *)((long)msg + (ulong)table->has_bits_offset);
        if (((ulong)puVar20 & 3) != 0) {
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222375;
          AlignFail(puVar20);
        }
        *puVar20 = *puVar20 | (uint)aStack_38.data;
      }
      return (char *)aVar29.data;
    }
    uVar34 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar29;
    if ((uVar34 & 7) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2223a8;
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar21 = (ulong)(uVar34 & 0xfffffff8);
    UNRECOVERED_JUMPTABLE_00 =
         (code *)((ulong)*(ushort *)aVar29 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2));
    UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar21);
    hasbits = aStack_38.data;
LAB_00221f84:
    pcVar11 = (*UNRECOVERED_JUMPTABLE_01)
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  case 0xe:
    pFVar48 = (FieldEntry *)((long)&table->has_bits_offset + (ulong)uVar26);
    pFVar10 = pFVar48;
    if (((ulong)pFVar48 & 3) != 0) {
LAB_002226ff:
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222704;
      AlignFail(pFVar10);
    }
    uVar46 = pFVar48->type_card;
    uVar30 = uVar46 & 0x30;
    if (uVar30 == 0x20) {
      if ((uVar46 & 0x1c0) == 0x40) {
        pcVar11 = MpRepeatedMessageOrGroup<true,true>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      }
      if ((uVar46 & 0x1c0) == 0) {
        pcVar11 = MpRepeatedMessageOrGroup<true,false>
                            (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                             hasbits);
        return pcVar11;
      }
LAB_002224b2:
      pcVar11 = (*table->fallback)(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,
                                   table,hasbits);
      return pcVar11;
    }
    if ((uVar46 & 0x1c0) == 0x40) {
      if ((uVar34 & 7) != 3) goto LAB_002224b2;
    }
    else if (((uVar46 & 0x1c0) != 0) || ((uVar34 & 7) != 2)) goto LAB_002224b2;
    aStack_50 = aVar29;
    aStack_38 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)UNRECOVERED_JUMPTABLE_00;
    if (uVar30 == 0x30) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2224e2;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      bVar52 = ChangeOneof(table,pFVar48,uVar34 >> 3,(ParseContext *)UNRECOVERED_JUMPTABLE_00,msg);
      aStack_58.data._4_4_ = (int)CONCAT71(extraout_var_01,bVar52);
    }
    else {
      if (uVar30 == 0x10) {
        pFVar10 = (FieldEntry *)
                  ((long)&msg->_vptr_MessageLite + (ulong)((uint)pFVar48->has_idx >> 5) * 4);
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
        if (((ulong)pFVar10 & 3) != 0) goto LAB_002226ff;
        pFVar10->offset = pFVar10->offset | 1 << ((byte)pFVar48->has_idx & 0x1f);
      }
      aStack_58.data = aStack_58.data & 0xffffffff;
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    }
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2224f6;
    pvVar18 = MaybeGetSplitBase(msg,true,table);
    if ((ulong)table->has_bits_offset != 0) {
      pFVar10 = (FieldEntry *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)pFVar10 & 3) != 0) goto LAB_002226ff;
      pFVar10->offset = pFVar10->offset | aVar37._0_4_;
    }
    plVar27 = (long *)((long)pvVar18 + (ulong)pFVar48->offset);
    if (((ulong)plVar27 & 7) != 0) {
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22270c;
      AlignFail(plVar27);
    }
    pTVar17 = *(TcParseTableBase **)
               ((long)&table->has_bits_offset +
               (ulong)pFVar48->aux_idx * 8 + (ulong)table->aux_offset);
    uVar51 = uVar46 >> 9 & 3;
    if ((short)uVar51 != 2) {
      if ((uVar46 >> 9 & 3) == 0) {
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
        ;
        pcVar11 = "tv == field_layout::kTvDefault || tv == field_layout::kTvWeakPtr";
        iVar9 = 0x9c8;
        goto LAB_00222762;
      }
      if (uVar51 != 1) {
        pTVar17 = *(TcParseTableBase **)pTVar17;
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222726;
      pTVar17 = MessageLite::GetTcParseTable((MessageLite *)pTVar17);
    }
    if ((byte)((byte)((ulong)aStack_58 >> 0x20) | *plVar27 == 0) == 1) {
      pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar39 & 1) != 0) {
        pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
      }
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222579;
      pMVar15 = ClassData::New(pTVar17->class_data,pAVar39);
      *plVar27 = (long)pMVar15;
    }
    if ((uVar46 & 0x1c0) == 0x40) {
      iVar9 = *(int *)(aStack_60.data + 0x58);
      lVar12 = (long)iVar9 + -1;
      iVar47 = (int)lVar12;
      *(int *)(aStack_60.data + 0x58) = iVar47;
      if ((long)iVar9 < 1) {
        return (char *)0x0;
      }
      lVar49 = (long)*(int *)(aStack_60.data + 0x5c) + 1;
      iVar9 = (int)lVar49;
      *(int *)(aStack_60.data + 0x5c) = iVar9;
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2225c6;
      pcVar16 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,(char *)aStack_50,(ParseContext *)aStack_60,
                           pTVar17);
      uVar3 = (uint32_t)aStack_38.data;
      if (pcVar16 == (char *)0x0) {
LAB_00222608:
        *(int *)(aStack_60.data + 0x5c) = *(int *)(aStack_60.data + 0x5c) + -1;
        *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ + 1;
        uVar5 = *(uint32_t *)(aStack_60.data + 0x50);
        *(uint32_t *)(aStack_60.data + 0x50) = 0;
        if (uVar5 == uVar3) {
          return pcVar16;
        }
        return (char *)0x0;
      }
      iVar4 = *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_;
      if (iVar47 == iVar4) {
        pcVar11 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222781;
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar12,(long)iVar4,"old_depth == depth_");
      }
      if (pcVar11 == (Nonnull<const_char_*>)0x0) {
        if (iVar9 == *(int *)(aStack_60.data + 0x5c)) {
          pcVar11 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2227b9;
          pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar49,(long)*(int *)(aStack_60.data + 0x5c),
                               "old_group_depth == group_depth_");
        }
        if (pcVar11 == (Nonnull<const_char_*>)0x0) goto LAB_00222608;
        iVar9 = 0x492;
      }
      else {
        iVar9 = 0x491;
      }
    }
    else {
      if ((char)*(byte *)aStack_50 < '\0') {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22263f;
        pVar60 = ReadSizeFallback((char *)aStack_50,(uint)*(byte *)aStack_50);
        pcVar11 = pVar60.first;
      }
      else {
        pcVar11 = (char *)(aStack_50.data + 1);
      }
      if ((pcVar11 == (char *)0x0) || (*(int *)(aStack_60.data + 0x58) < 1)) {
        pcVar11 = (char *)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22266d;
        EpsCopyInputStream::PushLimit
                  ((EpsCopyInputStream *)&aStack_48,(char *)aStack_60,(int)pcVar11);
        *(int *)(aStack_60.data + 0x58) = *(int *)(aStack_60.data + 0x58) + -1;
        uVar51 = aStack_48.data._0_4_;
      }
      if (pcVar11 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar9 = *(int *)(aStack_60.data + 0x58);
      aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22269e;
      pcVar16 = ParseLoopPreserveNone
                          ((MessageLite *)*plVar27,pcVar11,(ParseContext *)aStack_60,pTVar17);
      if (pcVar16 == (char *)0x0) {
LAB_002226c2:
        *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ =
             *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_ + 1;
        uVar34 = uVar51 + *(int *)(aStack_60.data + 0x1c);
        *(uint *)(aStack_60.data + 0x1c) = uVar34;
        if (*(uint32_t *)(aStack_60.data + 0x50) != 0) {
          return (char *)0x0;
        }
        *(char **)aStack_60 = *(char **)(aStack_60.data + 8) + (int)((int)uVar34 >> 0x1f & uVar34);
        return pcVar16;
      }
      iVar47 = *(int *)&((EpsCopyInputStream *)(aStack_60.data + 0x58))->limit_end_;
      if (iVar9 == iVar47) {
        pcVar11 = (Nonnull<const_char_*>)0x0;
      }
      else {
        aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22279d;
        pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar9,(long)iVar47,"old_depth == depth_");
      }
      if (pcVar11 == (Nonnull<const_char_*>)0x0) goto LAB_002226c2;
      iVar9 = 0x481;
    }
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
    ;
LAB_00222762:
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x222767;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&aStack_48,pcVar16,iVar9,pcVar11);
    aStack_70 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22276f;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&aStack_48);
  case 0xf:
    aVar40.data = (long)&table->has_bits_offset + (ulong)uVar26;
    if ((aVar40.data & 3) != 0) {
      AlignFail(aVar40.data);
    }
    aStack_88.data =
         (long)&table->has_bits_offset +
         (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset;
    bStack_a9 = *(byte *)(aStack_88.data + 4);
    if (((bStack_a9 & 1) == 0) || ((uVar34 & 7) != 2)) {
      pcVar11 = MpFallback(msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,
                           hasbits);
      return pcVar11;
    }
    uVar51 = *(undefined4 *)
              ((long)&table->has_bits_offset +
              (ulong)*(ushort *)(aVar40.data + 8) * 8 + (ulong)table->aux_offset);
    pvVar18 = MaybeGetSplitBase(msg,true,table);
    aVar50.data = (ulong)*(uint *)aVar40 + (long)pvVar18;
    aStack_50.data = aVar40.data;
    if ((bStack_a9 & 2) == 0) {
      if ((aVar50.data & 7) != 0) {
LAB_00222d60:
        AlignFail(aVar50.data);
      }
      if ((*(ulong *)aVar50 & 1) != 0) {
        (*MapFieldBaseForParse::sync_map_with_repeated)(aVar50.data,1);
      }
      aVar50.data = aVar50.data + 0x10;
    }
    else if ((aVar50.data & 7) != 0) goto LAB_00222d60;
    aStack_58.data._4_1_ = bStack_a9;
    aStack_58.data._0_4_ = uVar51;
    aStack_58.data._5_3_ = 0;
    goto LAB_002228eb;
  }
  aVar43.data = (long)&table->has_bits_offset + (ulong)uVar26;
  if ((aVar43.data & 3) != 0) {
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220944;
    AlignFail(aVar43.data);
  }
  if ((uVar34 & 7) != 2) {
    UNRECOVERED_JUMPTABLE_01 = table->fallback;
    goto LAB_0022060a;
  }
  uVar46 = *(ushort *)(aVar43.data + 10);
  uVar30 = uVar46 & 0x30;
  if (uVar30 == 0x20) {
    pcVar11 = MpRepeatedString<false>
                        (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits)
    ;
    return pcVar11;
  }
  if (uVar30 == 0x10) {
    aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)(*(uint *)(aVar43.data + 4) >> 5) * 4;
    if ((aVar40.data & 3) != 0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220962;
      aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
      aStack_38.data = hasbits;
      AlignFail();
    }
    *(uint *)aVar40 = *(uint *)aVar40 | 1 << ((byte)*(uint *)(aVar43.data + 4) & 0x1f);
LAB_00220674:
    bVar52 = false;
    aVar33 = aVar29;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_38.data = hasbits;
  }
  else {
    aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg;
    if (uVar30 != 0x30) goto LAB_00220674;
    aStack_60.data = 0x22066d;
    aVar33.data = aVar43.data;
    aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
    aStack_50 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)ctx;
    aStack_38.data = hasbits;
    bVar52 = ChangeOneof(table,(FieldEntry *)aVar43,uVar34 >> 3,(ParseContext *)(ulong)(uVar34 >> 3)
                         ,msg);
  }
  aVar50 = aStack_50;
  uVar44 = (uint16_t)hasbits;
  arena._0_4_ = uVar46 & 0x600;
  arena._4_4_ = 0;
  aStack_58.data = (ulong)CONCAT24(uVar46,aStack_58._0_4_) & 0x600ffffffff;
  if ((uVar46 & 0x1c0) == 0x140) {
    aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
    if ((aVar40.data & 7) != 0) goto LAB_00220965;
    if (bVar52 != false) {
      *(uint64_t *)aVar40 = 0;
    }
    aStack_48 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
    if ((aStack_48.data & 1) != 0) {
      aStack_48 = *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                   (aStack_48.data & 0xfffffffffffffffe);
    }
    bVar1 = *(byte *)aVar29;
    uVar34 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2207ac;
      pVar60 = ReadSizeFallback((char *)aVar29,(uint)bVar1);
      pcVar11 = pVar60.first;
      uVar34 = pVar60.second;
    }
    else {
      pcVar11 = (char *)(aVar29.data + 1);
    }
    aVar29 = aStack_50;
    if (pcVar11 == (char *)0x0) {
      aVar50.data = 0;
    }
    else {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2207ce;
      aStack_40.data = aVar40.data;
      iVar9 = EpsCopyInputStream::BytesAvailable((EpsCopyInputStream *)aStack_50,pcVar11);
      aVar40 = aStack_40;
      if (iVar9 < (int)uVar34) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2207ec;
        aVar50.data = (uint64_t)
                      EpsCopyInputStream::ReadMicroStringFallback
                                (aVar29.data,pcVar11,uVar34,aStack_40.data,aStack_48.data);
      }
      else {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220854;
        data._M_str = pcVar11;
        data._M_len = (long)(int)uVar34;
        MicroString::SetImpl((MicroString *)aStack_40,data,(Arena *)aStack_48,7);
        aVar50.data = (long)pcVar11 + (long)(int)uVar34;
      }
    }
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22085f;
    sVar56 = MicroString::Get((MicroString *)aVar40);
LAB_0022086b:
    wire_bytes._M_len = (uint64_t)sVar56._M_str;
    aStack_60.data = 0x220876;
    wire_bytes._M_str = (char *)table;
    bVar52 = MpVerifyUtf8((TcParser *)sVar56._M_len,wire_bytes,(TcParseTableBase *)aVar43,
                          (FieldEntry *)(ulong)(ushort)aStack_58.data._4_2_,uVar44);
    arena = (code *)aVar43;
  }
  else if ((uVar46 & 0x1c0) == 0x80) {
    if (uVar30 == 0x30) {
      if (bVar52 == false) {
        aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
        if ((aVar40.data & 7) != 0) goto LAB_00220965;
        wire_bytes._M_len = *aVar40.data;
      }
      else {
        pAVar39 = (Arena *)(msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar39 & 1) != 0) {
          pAVar39 = *(Arena **)((ulong)pAVar39 & 0xfffffffffffffffe);
        }
        if (pAVar39 == (Arena *)0x0) {
          aStack_60.data = 0x2209b2;
          wire_bytes._M_len = (anon_union_8_1_898a9ca8_for_TcFieldData_0)operator_new(0x10);
        }
        else {
          arena = cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
          aVar33.data = 0x10;
          aStack_60.data = 0x22072e;
          wire_bytes._M_len =
               (anon_union_8_1_898a9ca8_for_TcFieldData_0)
               Arena::AllocateAlignedWithCleanup
                         (pAVar39,0x10,8,cleanup::arena_destruct_object<absl::lts_20250127::Cord>);
        }
        *(undefined8 *)wire_bytes._M_len = 0;
        *(char **)(wire_bytes._M_len + 8) = (char *)0x0;
        aVar40.data = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
        if ((aVar40.data & 7) != 0) {
LAB_00220965:
          aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22096a;
          AlignFail(aVar40.data);
        }
        *(anon_union_8_1_898a9ca8_for_TcFieldData_0 *)aVar40 = (uint64_t)wire_bytes._M_len;
      }
    }
    else {
      wire_bytes._M_len = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
      if ((wire_bytes._M_len & 7) != 0) goto LAB_0022079a;
    }
    bVar1 = *(byte *)aVar29;
    if ((char)bVar1 < '\0') {
      aVar33.data._4_4_ = 0;
      aVar33.data._0_4_ = CONCAT31(0,bVar1);
      aStack_60.data = 0x2208a3;
      pVar57 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
    }
    else {
      pVar57.second._0_1_ = bVar1;
      pVar57.first = (undefined1 *)(aVar29.data + 1);
      pVar57._9_7_ = 0;
      aVar29 = aVar40;
    }
    entry = pVar57._8_8_;
    aVar43.data = (uint64_t)pVar57.first;
    if ((EpsCopyInputStream *)aVar43.data == (EpsCopyInputStream *)0x0) {
      aVar50.data = 0;
      wire_bytes._M_len = aVar33;
    }
    else {
      aStack_60.data = 0x2208bb;
      aVar29 = aStack_50;
      aVar50.data = (uint64_t)
                    EpsCopyInputStream::ReadCord
                              (aStack_50.data,(char *)aVar43,pVar57.second,wire_bytes._M_len);
      arena = (code *)wire_bytes._M_len;
      entry = extraout_RDX_01;
      wire_bytes._M_len = aVar43;
    }
    bVar52 = (EpsCopyInputStream *)aVar50.data != (EpsCopyInputStream *)0x0;
    if (bVar52) {
      arena._2_6_ = 0;
      arena._0_2_ = aStack_58._4_2_;
      aStack_60.data = 0x2208d5;
      MpVerifyUtf8((Cord *)aVar29,(TcParseTableBase *)wire_bytes._M_len,entry,aStack_58._4_2_);
      bVar52 = true;
    }
  }
  else {
    if ((uVar46 & 0x1c0) != 0) {
      aStack_60.data = (uint64_t)MpMessage<false>;
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0x967);
    }
    wire_bytes._M_len = (long)&msg->_vptr_MessageLite + (ulong)*(uint *)aVar43;
    if ((wire_bytes._M_len & 7) != 0) {
LAB_0022079a:
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2207a2;
      AlignFail(wire_bytes._M_len);
    }
    if (bVar52 != false) {
      *(undefined8 **)wire_bytes._M_len = &fixed_address_empty_string;
    }
    arena = (code *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = (code *)((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
                      ((ulong)arena & 0xfffffffffffffffe))->data;
    }
    if (arena == (code *)0x0) {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220803;
      psVar14 = ArenaStringPtr::MutableNoCopy_abi_cxx11_
                          ((ArenaStringPtr *)wire_bytes._M_len,(Arena *)0x0);
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x220811;
      aVar50.data = (uint64_t)InlineGreedyStringParser(psVar14,aVar29.data,aVar50.data);
    }
    else {
      aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2206ea;
      aVar50.data = (uint64_t)
                    EpsCopyInputStream::ReadArenaString
                              (aStack_50.data,aVar29.data,wire_bytes._M_len,(Arena *)arena);
    }
    if ((EpsCopyInputStream *)aVar50.data != (EpsCopyInputStream *)0x0) {
      sVar56._M_str = *(char **)(*(ulong *)wire_bytes._M_len & 0xfffffffffffffffc);
      sVar56._M_len = ((undefined8 *)(*(ulong *)wire_bytes._M_len & 0xfffffffffffffffc))[1];
      goto LAB_0022086b;
    }
    aStack_60.data = 0x22098d;
    anon_unknown_105::EnsureArenaStringIsNotDefault(msg,(ArenaStringPtr *)wire_bytes._M_len);
    bVar52 = false;
  }
  if ((bVar52 == false) || ((EpsCopyInputStream *)aVar50.data == (EpsCopyInputStream *)0x0)) {
    pcVar11 = Error(msg,(char *)wire_bytes._M_len,(ParseContext *)aStack_50,(TcFieldData)arena,table
                    ,aStack_38.data);
    return pcVar11;
  }
  if (*(EpsCopyInputStream **)aStack_50 <= aVar50.data) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar20 & 3) != 0) {
        aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x22099c;
        AlignFail(puVar20);
      }
      *puVar20 = *puVar20 | (uint)aStack_38.data;
    }
    return (char *)aVar50.data;
  }
  uVar34 = (uint)table->fast_idx_mask & (uint)*(ushort *)aVar50;
  if ((uVar34 & 7) != 0) {
    aStack_60 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x2209cf;
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar21 = (ulong)(uVar34 & 0xfffffff8);
  UNRECOVERED_JUMPTABLE_00 =
       (code *)((ulong)*(ushort *)aVar50 ^ *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2));
  UNRECOVERED_JUMPTABLE_01 = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar21);
  ctx = (ParseContext *)aStack_50;
  hasbits = aStack_38.data;
  aVar29 = aVar50;
LAB_0022060a:
  pcVar11 = (*UNRECOVERED_JUMPTABLE_01)
                      (msg,(char *)aVar29,ctx,(TcFieldData)UNRECOVERED_JUMPTABLE_00,table,hasbits);
  return pcVar11;
code_r0x00222abc:
  uVar26 = (uint)pcVar16 & 0xf;
  puVar20 = &switchD_00222acd::switchdataD_0038173c;
  uVar21 = (ulong)(int)(&switchD_00222acd::switchdataD_0038173c)[uVar26];
  bVar52 = 0xffffffffffc7e8c3 < uVar21;
  bVar55 = SCARRY8(uVar21,0x38173c);
  UNRECOVERED_JUMPTABLE_00 = (code *)((long)&switchD_00222acd::switchdataD_0038173c + uVar21);
  bVar53 = (long)UNRECOVERED_JUMPTABLE_00 < 0;
  aVar50 = aVar40;
  switch(uVar26) {
  case 0:
code_r0x00222ad2:
    KeyMapBase<bool>::InsertOrReplaceNode((KeyMapBase<bool> *)aVar40,(KeyNode *)aVar19);
    break;
  case 1:
    KeyMapBase<unsigned_int>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_int> *)aVar40,(KeyNode *)aVar19);
    break;
  case 2:
switchD_00222acd_caseD_2:
    KeyMapBase<unsigned_long>::InsertOrReplaceNode
              ((KeyMapBase<unsigned_long> *)aVar50,(KeyNode *)aVar19);
    break;
  default:
    goto switchD_00222acd_caseD_3;
  case 5:
    aVar29 = aVar40;
code_r0x00222aec:
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertOrReplaceNode((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)aVar29,(KeyNode *)aVar19);
    break;
  case 6:
    pcVar11 = (char *)(*UNRECOVERED_JUMPTABLE_00)();
    return pcVar11;
  case 7:
    pcVar11 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1536>
                        ((MessageLite *)aVar29,pcVar11,pPVar28,(TcFieldData)0x38173c,
                         (TcParseTableBase *)aVar43,aVar33.data);
    return pcVar11;
  case 8:
    aVar19 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)puVar20;
    ctx_00 = pPVar28;
    ctx = (ParseContext *)pcVar11;
    aVar40 = aVar29;
    aVar50 = aVar43;
code_r0x00222f52:
    pcVar11 = MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                        ((MessageLite *)aVar40,(char *)ctx,ctx_00,(TcFieldData)aVar19,
                         (TcParseTableBase *)aVar50,aVar33.data);
    return pcVar11;
  case 9:
    goto switchD_00222acd_caseD_9;
  case 10:
    uVar21 = (long)(int)UNRECOVERED_JUMPTABLE_00 * 0x38173c;
    bVar52 = (long)(int)uVar21 != uVar21;
    if (bVar52 != bVar53) {
      return (char *)wire_bytes._M_len;
    }
    out((short)(uVar21 >> 0x20),(int)uVar21);
    uVar34 = (**(code **)((uVar21 & 0xffffffff) + 0xf))();
    if (!bVar52) {
      halt_baddata();
    }
    bVar52 = 0x72b7ce88 < uVar34;
    bVar55 = SCARRY4(uVar34,-0x72b7ce89);
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)(uVar34 + 0x8d483177);
    bVar53 = (int)(uVar34 + 0x8d483177) < 0;
  case 0xc:
    if (bVar55 != bVar53) {
      return (char *)wire_bytes._M_len.data;
    }
    UNRECOVERED_JUMPTABLE_00[-0x73] =
         (code)((char)UNRECOVERED_JUMPTABLE_00[-0x73] + (char)puVar20 + bVar52);
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)((uint)UNRECOVERED_JUMPTABLE_00 | 0x15a627);
    goto code_r0x0022713d;
  case 0xb:
    UNRECOVERED_JUMPTABLE_00 = (code *)(ulong)(*(byte *)(aVar29.data + 0xf) & 0xf);
  case 0xf:
    if (5 < (uint)UNRECOVERED_JUMPTABLE_00) {
      UntypedMapBase::
      VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
                ();
    }
    puVar20 = &switchD_00227144::switchdataD_00381764;
code_r0x0022713d:
    pcVar11 = (char *)(*(code *)((long)(int)puVar20[(long)UNRECOVERED_JUMPTABLE_00] + (long)puVar20)
                      )();
    return pcVar11;
  case 0xd:
  case 0xe:
    uVar34 = (int)UNRECOVERED_JUMPTABLE_00 + 0x4634800 + (uint)((byte)*pcVar11 < *(byte *)aVar29);
    puVar20 = (uint *)((ulong)uVar34 + 1);
    *puVar20 = *puVar20 | 0xe8e0ffc8;
    ((undefined1 *)(aVar29.data + 1))[(ulong)bVar54 * -2] = (char)uVar34;
    return (char *)wire_bytes._M_len;
  }
  do {
    pPVar28 = (ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_;
    if (pPVar28 <= ctx_00) {
      uVar46 = table->has_bits_offset;
joined_r0x00222d23:
      if ((ulong)uVar46 != 0) {
        puVar20 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar46);
        if (((ulong)puVar20 & 3) != 0) {
          AlignFail();
        }
        *puVar20 = *puVar20 | aVar37._0_4_;
      }
      return (char *)ctx_00;
    }
    bVar1 = *(byte *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
    uVar26 = (uint)bVar1;
    aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 1;
    if ((char)bVar1 < '\0') {
      uVar36 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
      lVar12 = CONCAT71(uVar36,*(char *)aVar29);
      if (*(char *)aVar29 < '\0') {
        uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
        cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2);
        lVar12 = CONCAT71(uVar36,cVar2);
        if (cVar2 < '\0') {
          uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
          cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3);
          lVar12 = CONCAT71(uVar36,cVar2);
          if (cVar2 < '\0') {
            uVar36 = uVar36 >> 7 | (uint7)((ulong)(lVar12 << 0x39) >> 8);
            cVar2 = *(char *)((long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4);
            if (cVar2 < '\0') {
              uVar26 = 0;
              aVar29.data = 0;
            }
            else {
              uVar26 = (int)CONCAT71(uVar36,cVar2) << 0x1c | (uint)(uVar36 >> 0x1c);
              aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 5;
            }
          }
          else {
            uVar26 = (int)lVar12 << 0x15 | (uint)(uVar36 >> 0x23);
            aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 4;
          }
        }
        else {
          uVar26 = (int)lVar12 << 0xe | (uint)(uVar36 >> 0x2a);
          aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 3;
        }
      }
      else {
        uVar26 = (int)lVar12 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
        aVar29.data = (long)&(ctx_00->super_EpsCopyInputStream).limit_end_ + 2;
      }
    }
    if (uVar26 != uVar34) {
      if (ctx_00 < pPVar28) {
        uVar46 = *(ushort *)&(ctx_00->super_EpsCopyInputStream).limit_end_;
        uVar34 = (uint)table->fast_idx_mask & (uint)uVar46;
        if ((uVar34 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar21 = (ulong)(uVar34 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar21))
                                    (msg,ctx_00,ctx,
                                     (ulong)uVar46 ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar21 * 2),table,hasbits)
        ;
        return pcVar11;
      }
      uVar46 = table->has_bits_offset;
      goto joined_r0x00222d23;
    }
LAB_002228eb:
    pcVar11._2_6_ = 0;
    pcVar11._0_2_ = *(ushort *)(aVar50.data + 0xc);
    aVar19.data = (uint64_t)UntypedMapBase::AllocNode(aVar50.data,(size_t)pcVar11);
    uVar46 = *(ushort *)(aVar50.data + 0xc);
    uVar21 = (ulong)uVar46 - 8;
    if (uVar21 < 8) {
      pcVar11 = (char *)0x8;
      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,unsigned_long>
                          (uVar21,8,"node_end - static_cast<char*>(node_key) >= sizeof(uint64_t)");
    }
    else {
      pcVar22 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar22 != (Nonnull<const_char_*>)0x0) {
      pcVar11 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
      aVar33.data = (uint64_t)&aStack_80;
      iVar9 = 0xb2c;
      goto LAB_00222db0;
    }
    *(char **)(aVar19.data + 8) = (char *)0x0;
    *(undefined8 *)((long)(aVar19.data - 8) + (ulong)uVar46) = 0;
    aVar33.data = (uint64_t)&aStack_48;
    f_01.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2866:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2870:19)>
              *)aVar33.data;
    f_01.this = (UntypedMapBase *)aVar50.data;
    f_01.node = (NodeBase **)&aStack_60;
    aStack_80 = aVar50;
    aStack_78.data = aVar33.data;
    aStack_70.data = (uint64_t)&aStack_60;
    aStack_60 = aVar19;
    aStack_48 = aVar50;
    UntypedMapBase::
    VisitKeyType<google::protobuf::internal::UntypedMapBase::VisitKey<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_1_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar50,f_01);
    aStack_40.data = (uint64_t)&aStack_88;
    f_02.f = (Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2875:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2878:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_generated_message_tctable_lite_cc:2882:19)>
              *)aVar33.data;
    f_02.this = (UntypedMapBase *)aVar50.data;
    f_02.node = (NodeBase **)&aStack_60;
    aVar40 = aVar50;
    wire_bytes._M_len = aVar50;
    aStack_80 = aVar50;
    aStack_78.data = aVar33.data;
    aStack_70.data = (uint64_t)&aStack_60;
    aStack_60 = aVar19;
    aStack_48 = aVar50;
    aStack_38 = aVar50;
    UntypedMapBase::
    VisitValueType<google::protobuf::internal::UntypedMapBase::VisitValue<absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>>(google::protobuf::internal::NodeBase*,absl::lts_20250127::Overload<google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(std::__cxx11::string*)_2_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(google::protobuf::MessageLite*)_1_,google::protobuf::internal::TcParser::MpMap<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(void*)_2_>)const::_lambda(auto:1)_1_>
              ((UntypedMapBase *)aVar50,f_02);
    bVar1 = *(byte *)aVar29;
    aVar38.data._1_7_ = 0;
    aVar38.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      pcVar11._4_4_ = 0;
      pcVar11._0_4_ = CONCAT31(0,bVar1);
      pVar61 = ReadSizeFallback((char *)aVar29,CONCAT31(0,bVar1));
      aVar38.data = pVar61._8_8_ & 0xffffffff;
    }
    else {
      pVar61._8_8_ = extraout_RDX_14;
      pVar61.first = (char *)(aVar29.data + 1);
      aVar29 = aVar40;
    }
    pPVar28 = pVar61._8_8_;
    aVar40.data = (uint64_t)pVar61.first;
    if (((EpsCopyInputStream *)aVar40.data == (EpsCopyInputStream *)0x0) || (ctx->depth_ < 1)) {
      aVar40.data = 0;
    }
    else {
      aVar29.data = (uint64_t)&aStack_80;
      pcVar11 = (char *)ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)aVar29,(char *)ctx,(int)pVar61.first);
      auStack_68._4_4_ = aStack_80.data._0_4_;
      ctx->depth_ = ctx->depth_ + -1;
      pPVar28 = extraout_RDX_15;
    }
    if ((EpsCopyInputStream *)aVar40.data == (EpsCopyInputStream *)0x0) {
LAB_00222a63:
      ctx_00 = (ParseContext *)0x0;
    }
    else {
      iVar9 = ctx->depth_;
      aVar33 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)iVar9;
      aVar38 = aStack_88;
      aVar29 = aVar19;
      aVar43 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)table;
      wire_bytes._M_len = aVar50;
      ctx_00 = (ParseContext *)
               ParseOneMapEntry((NodeBase *)aVar19,(char *)aVar40,ctx,(FieldAux *)aStack_88,table,
                                (FieldEntry *)aStack_50,(UntypedMapBase *)aVar50);
      pPVar28 = extraout_RDX_16;
      if (ctx_00 != (ParseContext *)0x0) {
        aVar40 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(long)ctx->depth_;
        if (iVar9 == ctx->depth_) {
          pcVar22 = (Nonnull<const_char_*>)0x0;
        }
        else {
          aVar29 = aVar33;
          pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (aVar33.data,aVar40.data,"old_depth == depth_");
          pPVar28 = extraout_RDX_17;
        }
        if (pcVar22 != (Nonnull<const_char_*>)0x0) {
          pcVar11 = 
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
          ;
          aVar33.data = (uint64_t)&aStack_80;
          goto switchD_002210ca_caseD_9;
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      uVar26 = (ctx->super_EpsCopyInputStream).limit_ + auStack_68._4_4_;
      (ctx->super_EpsCopyInputStream).limit_ = uVar26;
      pcVar11 = (char *)aVar40;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_00222a63;
      aVar38._0_4_ = (int)uVar26 >> 0x1f & uVar26;
      aVar38.data._4_4_ = 0;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar38._0_4_;
    }
    if (ctx_00 == (ParseContext *)0x0) {
      if (*(long *)(aVar50.data + 0x18) == 0) {
        UntypedMapBase::DeleteNode((UntypedMapBase *)aVar50,(NodeBase *)aVar19);
        pPVar28 = extraout_RDX_18;
        pcVar11 = (char *)aVar19;
      }
      pcVar11 = Error(msg,pcVar11,pPVar28,(TcFieldData)aVar38,table,hasbits);
      return pcVar11;
    }
    if ((bStack_a9 & 0x10) == 0) break;
    puVar20 = (uint *)UntypedMapBase::GetValue<int>((UntypedMapBase *)aVar50,(NodeBase *)aVar19);
    uVar26 = *puVar20;
    puVar20 = *(uint **)(aStack_88.data + 8);
    pcVar11 = (char *)(long)(short)*puVar20;
    aVar29.data._0_4_ = *puVar20 >> 0x10;
    aVar29.data._4_4_ = 0;
    pPVar28 = (ParseContext *)(((long)(int)uVar26 - (long)pcVar11) - (long)aVar29);
    if ((EpsCopyInputStream *)((long)(int)uVar26 - (long)pcVar11) < aVar29.data) break;
    uVar23 = puVar20[1];
    pcVar11._4_4_ = 0;
    pcVar11._0_4_ = uVar23;
    aVar29.data._2_6_ = 0;
    aVar29.data._0_2_ = (ushort)uVar23;
    if (pPVar28 < (ulong)aVar29) {
      aVar29.data._1_1_ = (char)(uVar23 >> 8);
      aVar29.data._0_1_ = (puVar20[((ulong)pPVar28 >> 5) + 2] >> ((uint)pPVar28 & 0x1f) & 1) != 0;
      aVar29.data._2_6_ = 0;
    }
    else {
      pPVar28 = (ParseContext *)(ulong)(uVar23 >> 0x10);
      aVar40.data = 0;
      while (pcVar11 = (char *)aVar40, aVar29._1_7_ = (undefined7)((ulong)aVar29 >> 8),
            aVar29.data._0_1_ = pcVar11 < pPVar28, pcVar11 < pPVar28) {
        uVar45 = *(uint *)((long)puVar20 + (long)pcVar11 * 4 + (ulong)(uVar23 >> 3 & 0x1ffc) + 8);
        aVar29.data._4_4_ = 0;
        aVar29.data._0_4_ = uVar45;
        aVar43.data = ((long)pcVar11 * 2 - (ulong)((int)uVar26 < (int)uVar45)) + 2;
        aVar40.data = aVar43.data;
        if (uVar45 == uVar26) goto LAB_00222aa7;
      }
    }
    if ((char)aVar29.data != '\0') break;
    WriteMapEntryAsUnknown
              (msg,table,(UntypedMapBase *)aVar50,uVar34,(NodeBase *)aVar19,SUB85(aStack_58.data,0))
    ;
    aVar43 = aVar19;
  } while( true );
LAB_00222aa7:
  pcVar16 = (char *)(ulong)(*(uint *)(aVar50.data + 0xc) >> 0x18);
  aVar40 = aVar50;
  if (5 < ((byte)(*(uint *)(aVar50.data + 0xc) >> 0x18) & 0xf)) {
switchD_00222acd_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                ,0xb68);
  }
  goto code_r0x00222abc;
switchD_00222acd_caseD_9:
  pcVar11 = MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                      ((MessageLite *)aVar29,pcVar11,pPVar28,(TcFieldData)puVar20,
                       (TcParseTableBase *)aVar43,aVar33.data);
  return pcVar11;
switchD_002210ca_caseD_9:
  iVar9 = 0x481;
LAB_00222db0:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aVar33,pcVar11,iVar9,pcVar22);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aVar33);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MiniParse(
    PROTOBUF_TC_PARAM_NO_DATA_DECL) {
  PROTOBUF_MUSTTAIL return MiniParse<false>(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}